

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,int param_2,bool param_3)

{
  double dVar1;
  byte bVar2;
  uint uVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long *plVar5;
  long *plVar6;
  long lVar7;
  long *plVar8;
  long *plVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  bool bVar19;
  int iVar20;
  fpclass_type fVar21;
  int iVar22;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  cpp_dec_float<200U,_int,_void> *pcVar23;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  cpp_dec_float<200U,_int,_void> *pcVar28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar29;
  uint *puVar30;
  cpp_dec_float<200U,_int,_void> *pcVar31;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar32;
  uint *puVar33;
  long lVar34;
  long in_FS_OFFSET;
  byte bVar35;
  ulong uVar36;
  Real a;
  uint local_fd4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  uint local_f44;
  SPxId enterId;
  cpp_dec_float<200U,_int,_void> local_f08;
  long *local_e88;
  long *local_e80;
  cpp_dec_float<200U,_int,_void> local_e78;
  cpp_dec_float<200U,_int,_void> *local_df0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<200U,_int,_void> local_d58;
  cpp_dec_float<200U,_int,_void> local_cd8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_bc8;
  cpp_dec_float<200U,_int,_void> local_b48;
  cpp_dec_float<200U,_int,_void> local_ac8;
  double local_a48;
  undefined8 uStack_a40;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  degeneps;
  cpp_dec_float<200U,_int,_void> local_9b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 local_858 [13];
  undefined3 uStack_84b;
  int iStack_848;
  bool bStack_844;
  undefined8 local_840;
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  undefined1 local_7d8 [13];
  undefined3 uStack_7cb;
  int iStack_7c8;
  bool bStack_7c4;
  undefined8 local_7c0;
  undefined1 local_7b8 [16];
  undefined1 local_7a8 [16];
  undefined1 local_798 [16];
  undefined1 local_788 [16];
  undefined1 local_778 [16];
  undefined1 local_768 [16];
  undefined1 local_758 [13];
  undefined3 uStack_74b;
  int iStack_748;
  bool bStack_744;
  undefined8 local_740;
  undefined1 local_738 [16];
  undefined1 local_728 [16];
  undefined1 local_718 [16];
  undefined1 local_708 [16];
  undefined1 local_6f8 [16];
  undefined1 local_6e8 [16];
  undefined1 local_6d8 [13];
  undefined3 uStack_6cb;
  int iStack_6c8;
  bool bStack_6c4;
  undefined8 local_6c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minStability;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rmaxabs;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  cmaxabs;
  cpp_dec_float<200u,int,void> local_538 [16];
  undefined1 local_528 [16];
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [13];
  undefined3 uStack_4cb;
  undefined5 uStack_4c8;
  undefined8 local_4c0;
  cpp_dec_float<200u,int,void> local_4b8 [16];
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [13];
  undefined3 uStack_44b;
  undefined5 uStack_448;
  undefined8 local_440;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar35 = 0;
  enterId.super_DataKey.info = 0;
  enterId.super_DataKey.idx = -1;
  local_cd8.fpclass = cpp_dec_float_finite;
  local_cd8.prec_elem = 0x1c;
  local_cd8.data._M_elems[0] = 0;
  local_cd8.data._M_elems[1] = 0;
  local_cd8.data._M_elems[2] = 0;
  local_cd8.data._M_elems[3] = 0;
  local_cd8.data._M_elems[4] = 0;
  local_cd8.data._M_elems[5] = 0;
  local_cd8.data._M_elems[6] = 0;
  local_cd8.data._M_elems[7] = 0;
  local_cd8.data._M_elems[8] = 0;
  local_cd8.data._M_elems[9] = 0;
  local_cd8.data._M_elems[10] = 0;
  local_cd8.data._M_elems[0xb] = 0;
  local_cd8.data._M_elems[0xc] = 0;
  local_cd8.data._M_elems[0xd] = 0;
  local_cd8.data._M_elems[0xe] = 0;
  local_cd8.data._M_elems[0xf] = 0;
  local_cd8.data._M_elems[0x10] = 0;
  local_cd8.data._M_elems[0x11] = 0;
  local_cd8.data._M_elems[0x12] = 0;
  local_cd8.data._M_elems[0x13] = 0;
  local_cd8.data._M_elems[0x14] = 0;
  local_cd8.data._M_elems[0x15] = 0;
  local_cd8.data._M_elems[0x16] = 0;
  local_cd8.data._M_elems[0x17] = 0;
  local_cd8.data._M_elems[0x18] = 0;
  local_cd8.data._M_elems[0x19] = 0;
  local_cd8.data._M_elems._104_5_ = 0;
  local_cd8.data._M_elems[0x1b]._1_3_ = 0;
  local_cd8.exp = 0;
  local_cd8.neg = false;
  local_f08.fpclass = cpp_dec_float_finite;
  local_f08.prec_elem = 0x1c;
  local_f08.data._M_elems[0] = 0;
  local_f08.data._M_elems[1] = 0;
  local_f08.data._M_elems[2] = 0;
  local_f08.data._M_elems[3] = 0;
  local_f08.data._M_elems[4] = 0;
  local_f08.data._M_elems[5] = 0;
  local_f08.data._M_elems[6] = 0;
  local_f08.data._M_elems[7] = 0;
  local_f08.data._M_elems[8] = 0;
  local_f08.data._M_elems[9] = 0;
  local_f08.data._M_elems[10] = 0;
  local_f08.data._M_elems[0xb] = 0;
  local_f08.data._M_elems[0xc] = 0;
  local_f08.data._M_elems[0xd] = 0;
  local_f08.data._M_elems[0xe] = 0;
  local_f08.data._M_elems[0xf] = 0;
  local_f08.data._M_elems[0x10] = 0;
  local_f08.data._M_elems[0x11] = 0;
  local_f08.data._M_elems[0x12] = 0;
  local_f08.data._M_elems[0x13] = 0;
  local_f08.data._M_elems[0x14] = 0;
  local_f08.data._M_elems[0x15] = 0;
  local_f08.data._M_elems[0x16] = 0;
  local_f08.data._M_elems[0x17] = 0;
  local_f08.data._M_elems[0x18] = 0;
  local_f08.data._M_elems[0x19] = 0;
  local_f08.data._M_elems._104_5_ = 0;
  local_f08.data._M_elems[0x1b]._1_3_ = 0;
  local_f08.exp = 0;
  local_f08.neg = false;
  local_e78.fpclass = cpp_dec_float_finite;
  local_e78.prec_elem = 0x1c;
  local_e78.data._M_elems[0] = 0;
  local_e78.data._M_elems[1] = 0;
  local_e78.data._M_elems[2] = 0;
  local_e78.data._M_elems[3] = 0;
  local_e78.data._M_elems[4] = 0;
  local_e78.data._M_elems[5] = 0;
  local_e78.data._M_elems[6] = 0;
  local_e78.data._M_elems[7] = 0;
  local_e78.data._M_elems[8] = 0;
  local_e78.data._M_elems[9] = 0;
  local_e78.data._M_elems[10] = 0;
  local_e78.data._M_elems[0xb] = 0;
  local_e78.data._M_elems[0xc] = 0;
  local_e78.data._M_elems[0xd] = 0;
  local_e78.data._M_elems[0xe] = 0;
  local_e78.data._M_elems[0xf] = 0;
  local_e78.data._M_elems[0x10] = 0;
  local_e78.data._M_elems[0x11] = 0;
  local_e78.data._M_elems[0x12] = 0;
  local_e78.data._M_elems[0x13] = 0;
  local_e78.data._M_elems[0x14] = 0;
  local_e78.data._M_elems[0x15] = 0;
  local_e78.data._M_elems[0x16] = 0;
  local_e78.data._M_elems[0x17] = 0;
  local_e78.data._M_elems[0x18] = 0;
  local_e78.data._M_elems[0x19] = 0;
  local_e78.data._M_elems._104_5_ = 0;
  local_e78.data._M_elems[0x1b]._1_3_ = 0;
  local_e78.exp = 0;
  local_e78.neg = false;
  local_ac8.fpclass = cpp_dec_float_finite;
  local_ac8.prec_elem = 0x1c;
  local_ac8.data._M_elems[0] = 0;
  local_ac8.data._M_elems[1] = 0;
  local_ac8.data._M_elems[2] = 0;
  local_ac8.data._M_elems[3] = 0;
  local_ac8.data._M_elems[4] = 0;
  local_ac8.data._M_elems[5] = 0;
  local_ac8.data._M_elems[6] = 0;
  local_ac8.data._M_elems[7] = 0;
  local_ac8.data._M_elems[8] = 0;
  local_ac8.data._M_elems[9] = 0;
  local_ac8.data._M_elems[10] = 0;
  local_ac8.data._M_elems[0xb] = 0;
  local_ac8.data._M_elems[0xc] = 0;
  local_ac8.data._M_elems[0xd] = 0;
  local_ac8.data._M_elems[0xe] = 0;
  local_ac8.data._M_elems[0xf] = 0;
  local_ac8.data._M_elems[0x10] = 0;
  local_ac8.data._M_elems[0x11] = 0;
  local_ac8.data._M_elems[0x12] = 0;
  local_ac8.data._M_elems[0x13] = 0;
  local_ac8.data._M_elems[0x14] = 0;
  local_ac8.data._M_elems[0x15] = 0;
  local_ac8.data._M_elems[0x16] = 0;
  local_ac8.data._M_elems[0x17] = 0;
  local_ac8.data._M_elems[0x18] = 0;
  local_ac8.data._M_elems[0x19] = 0;
  local_ac8.data._M_elems._104_5_ = 0;
  local_ac8.data._M_elems[0x1b]._1_3_ = 0;
  local_ac8.exp = 0;
  local_ac8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_ac8,0.0);
  local_d58.fpclass = cpp_dec_float_finite;
  local_d58.prec_elem = 0x1c;
  local_d58.data._M_elems[0] = 0;
  local_d58.data._M_elems[1] = 0;
  local_d58.data._M_elems[2] = 0;
  local_d58.data._M_elems[3] = 0;
  local_d58.data._M_elems[4] = 0;
  local_d58.data._M_elems[5] = 0;
  local_d58.data._M_elems[6] = 0;
  local_d58.data._M_elems[7] = 0;
  local_d58.data._M_elems[8] = 0;
  local_d58.data._M_elems[9] = 0;
  local_d58.data._M_elems[10] = 0;
  local_d58.data._M_elems[0xb] = 0;
  local_d58.data._M_elems[0xc] = 0;
  local_d58.data._M_elems[0xd] = 0;
  local_d58.data._M_elems[0xe] = 0;
  local_d58.data._M_elems[0xf] = 0;
  local_d58.data._M_elems[0x10] = 0;
  local_d58.data._M_elems[0x11] = 0;
  local_d58.data._M_elems[0x12] = 0;
  local_d58.data._M_elems[0x13] = 0;
  local_d58.data._M_elems[0x14] = 0;
  local_d58.data._M_elems[0x15] = 0;
  local_d58.data._M_elems[0x16] = 0;
  local_d58.data._M_elems[0x17] = 0;
  local_d58.data._M_elems[0x18] = 0;
  local_d58.data._M_elems[0x19] = 0;
  local_d58.data._M_elems._104_5_ = 0;
  local_d58.data._M_elems[0x1b]._1_3_ = 0;
  local_d58.exp = 0;
  local_d58.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_d58,0.0);
  local_9b8.fpclass = cpp_dec_float_finite;
  local_9b8.prec_elem = 0x1c;
  local_9b8.data._M_elems[0] = 0;
  local_9b8.data._M_elems[1] = 0;
  local_9b8.data._M_elems[2] = 0;
  local_9b8.data._M_elems[3] = 0;
  local_9b8.data._M_elems[4] = 0;
  local_9b8.data._M_elems[5] = 0;
  local_9b8.data._M_elems[6] = 0;
  local_9b8.data._M_elems[7] = 0;
  local_9b8.data._M_elems[8] = 0;
  local_9b8.data._M_elems[9] = 0;
  local_9b8.data._M_elems[10] = 0;
  local_9b8.data._M_elems[0xb] = 0;
  local_9b8.data._M_elems[0xc] = 0;
  local_9b8.data._M_elems[0xd] = 0;
  local_9b8.data._M_elems[0xe] = 0;
  local_9b8.data._M_elems[0xf] = 0;
  local_9b8.data._M_elems[0x10] = 0;
  local_9b8.data._M_elems[0x11] = 0;
  local_9b8.data._M_elems[0x12] = 0;
  local_9b8.data._M_elems[0x13] = 0;
  local_9b8.data._M_elems[0x14] = 0;
  local_9b8.data._M_elems[0x15] = 0;
  local_9b8.data._M_elems[0x16] = 0;
  local_9b8.data._M_elems[0x17] = 0;
  local_9b8.data._M_elems[0x18] = 0;
  local_9b8.data._M_elems[0x19] = 0;
  local_9b8.data._M_elems._104_5_ = 0;
  local_9b8.data._M_elems[0x1b]._1_3_ = 0;
  local_9b8.exp = 0;
  local_9b8.neg = false;
  local_b48.fpclass = cpp_dec_float_finite;
  local_b48.prec_elem = 0x1c;
  local_b48.data._M_elems[0] = 0;
  local_b48.data._M_elems[1] = 0;
  local_b48.data._M_elems[2] = 0;
  local_b48.data._M_elems[3] = 0;
  local_b48.data._M_elems[4] = 0;
  local_b48.data._M_elems[5] = 0;
  local_b48.data._M_elems[6] = 0;
  local_b48.data._M_elems[7] = 0;
  local_b48.data._M_elems[8] = 0;
  local_b48.data._M_elems[9] = 0;
  local_b48.data._M_elems[10] = 0;
  local_b48.data._M_elems[0xb] = 0;
  local_b48.data._M_elems[0xc] = 0;
  local_b48.data._M_elems[0xd] = 0;
  local_b48.data._M_elems[0xe] = 0;
  local_b48.data._M_elems[0xf] = 0;
  local_b48.data._M_elems[0x10] = 0;
  local_b48.data._M_elems[0x11] = 0;
  local_b48.data._M_elems[0x12] = 0;
  local_b48.data._M_elems[0x13] = 0;
  local_b48.data._M_elems[0x14] = 0;
  local_b48.data._M_elems[0x15] = 0;
  local_b48.data._M_elems[0x16] = 0;
  local_b48.data._M_elems[0x17] = 0;
  local_b48.data._M_elems[0x18] = 0;
  local_b48.data._M_elems[0x19] = 0;
  local_b48.data._M_elems._104_5_ = 0;
  local_b48.data._M_elems[0x1b]._1_3_ = 0;
  local_b48.exp = 0;
  local_b48.neg = false;
  local_bc8.fpclass = cpp_dec_float_finite;
  local_bc8.prec_elem = 0x1c;
  local_bc8.data._M_elems[0] = 0;
  local_bc8.data._M_elems[1] = 0;
  local_bc8.data._M_elems[2] = 0;
  local_bc8.data._M_elems[3] = 0;
  local_bc8.data._M_elems[4] = 0;
  local_bc8.data._M_elems[5] = 0;
  local_bc8.data._M_elems[6] = 0;
  local_bc8.data._M_elems[7] = 0;
  local_bc8.data._M_elems[8] = 0;
  local_bc8.data._M_elems[9] = 0;
  local_bc8.data._M_elems[10] = 0;
  local_bc8.data._M_elems[0xb] = 0;
  local_bc8.data._M_elems[0xc] = 0;
  local_bc8.data._M_elems[0xd] = 0;
  local_bc8.data._M_elems[0xe] = 0;
  local_bc8.data._M_elems[0xf] = 0;
  local_bc8.data._M_elems[0x10] = 0;
  local_bc8.data._M_elems[0x11] = 0;
  local_bc8.data._M_elems[0x12] = 0;
  local_bc8.data._M_elems[0x13] = 0;
  local_bc8.data._M_elems[0x14] = 0;
  local_bc8.data._M_elems[0x15] = 0;
  local_bc8.data._M_elems[0x16] = 0;
  local_bc8.data._M_elems[0x17] = 0;
  local_bc8.data._M_elems[0x18] = 0;
  local_bc8.data._M_elems[0x19] = 0;
  local_bc8.data._M_elems._104_5_ = 0;
  local_bc8.data._M_elems[0x1b]._1_3_ = 0;
  local_bc8.exp = 0;
  local_bc8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&cmaxabs.m_backend,1,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&rmaxabs.m_backend,1,(type *)0x0);
  peVar4 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  dVar1 = peVar4->s_epsilon_multiplier;
  uVar36 = -(ulong)(dVar1 == 1.0);
  minStability.m_backend.fpclass = cpp_dec_float_finite;
  minStability.m_backend.prec_elem = 0x1c;
  minStability.m_backend.data._M_elems[0] = 0;
  minStability.m_backend.data._M_elems[1] = 0;
  minStability.m_backend.data._M_elems[2] = 0;
  minStability.m_backend.data._M_elems[3] = 0;
  minStability.m_backend.data._M_elems[4] = 0;
  minStability.m_backend.data._M_elems[5] = 0;
  minStability.m_backend.data._M_elems[6] = 0;
  minStability.m_backend.data._M_elems[7] = 0;
  minStability.m_backend.data._M_elems[8] = 0;
  minStability.m_backend.data._M_elems[9] = 0;
  minStability.m_backend.data._M_elems[10] = 0;
  minStability.m_backend.data._M_elems[0xb] = 0;
  minStability.m_backend.data._M_elems[0xc] = 0;
  minStability.m_backend.data._M_elems[0xd] = 0;
  minStability.m_backend.data._M_elems[0xe] = 0;
  minStability.m_backend.data._M_elems[0xf] = 0;
  minStability.m_backend.data._M_elems[0x10] = 0;
  minStability.m_backend.data._M_elems[0x11] = 0;
  minStability.m_backend.data._M_elems[0x12] = 0;
  minStability.m_backend.data._M_elems[0x13] = 0;
  minStability.m_backend.data._M_elems[0x14] = 0;
  minStability.m_backend.data._M_elems[0x15] = 0;
  minStability.m_backend.data._M_elems[0x16] = 0;
  minStability.m_backend.data._M_elems[0x17] = 0;
  minStability.m_backend.data._M_elems[0x18] = 0;
  minStability.m_backend.data._M_elems[0x19] = 0;
  minStability.m_backend.data._M_elems._104_5_ = 0;
  minStability.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  minStability.m_backend.exp = 0;
  minStability.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&minStability,
             (double)(~uVar36 & (ulong)(dVar1 * 0.0001) | uVar36 & 0x3f1a36e2eb1c432d));
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  iVar20 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  a = Tolerances::epsilon(*(Tolerances **)(CONCAT44(extraout_var,iVar20) + 0x228));
  epsilon.m_backend.fpclass = cpp_dec_float_finite;
  epsilon.m_backend.prec_elem = 0x1c;
  epsilon.m_backend.data._M_elems[0] = 0;
  epsilon.m_backend.data._M_elems[1] = 0;
  epsilon.m_backend.data._M_elems[2] = 0;
  epsilon.m_backend.data._M_elems[3] = 0;
  epsilon.m_backend.data._M_elems[4] = 0;
  epsilon.m_backend.data._M_elems[5] = 0;
  epsilon.m_backend.data._M_elems[6] = 0;
  epsilon.m_backend.data._M_elems[7] = 0;
  epsilon.m_backend.data._M_elems[8] = 0;
  epsilon.m_backend.data._M_elems[9] = 0;
  epsilon.m_backend.data._M_elems[10] = 0;
  epsilon.m_backend.data._M_elems[0xb] = 0;
  epsilon.m_backend.data._M_elems[0xc] = 0;
  epsilon.m_backend.data._M_elems[0xd] = 0;
  epsilon.m_backend.data._M_elems[0xe] = 0;
  epsilon.m_backend.data._M_elems[0xf] = 0;
  epsilon.m_backend.data._M_elems[0x10] = 0;
  epsilon.m_backend.data._M_elems[0x11] = 0;
  epsilon.m_backend.data._M_elems[0x12] = 0;
  epsilon.m_backend.data._M_elems[0x13] = 0;
  epsilon.m_backend.data._M_elems[0x14] = 0;
  epsilon.m_backend.data._M_elems[0x15] = 0;
  epsilon.m_backend.data._M_elems[0x16] = 0;
  epsilon.m_backend.data._M_elems[0x17] = 0;
  epsilon.m_backend.data._M_elems[0x18] = 0;
  epsilon.m_backend.data._M_elems[0x19] = 0;
  epsilon.m_backend.data._M_elems._104_5_ = 0;
  epsilon.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  epsilon.m_backend.exp = 0;
  epsilon.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&epsilon,a);
  degenerateEps(&degeneps,this);
  iVar20 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  plVar5 = *(long **)(CONCAT44(extraout_var_00,iVar20) + 0x1000);
  iVar20 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  lVar27 = *(long *)(CONCAT44(extraout_var_01,iVar20) + 0x1000);
  iVar20 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  plVar6 = *(long **)(CONCAT44(extraout_var_02,iVar20) + 0xff8);
  iVar20 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  lVar7 = *(long *)(CONCAT44(extraout_var_03,iVar20) + 0xff8);
  iVar20 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_e80 = *(long **)(CONCAT44(extraout_var_04,iVar20) + 0x1018);
  iVar20 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_e88 = *(long **)(CONCAT44(extraout_var_05,iVar20) + 0x1020);
  iVar20 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  plVar8 = *(long **)(CONCAT44(extraout_var_06,iVar20) + 0x1028);
  iVar20 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  plVar9 = *(long **)(CONCAT44(extraout_var_07,iVar20) + 0x1030);
  iVar20 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var_08,iVar20) + 0xff8) + 0x98));
  iVar20 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var_09,iVar20) + 0x1000) + 0x98));
  if ((((val->m_backend).fpclass != cpp_dec_float_NaN) &&
      (epsilon.m_backend.fpclass != cpp_dec_float_NaN)) &&
     (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         (&val->m_backend,&epsilon.m_backend), 0 < iVar20)) {
    local_a48 = -*(double *)(in_FS_OFFSET + -8);
    uStack_a40 = 0x8000000000000000;
    local_df0 = &(this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).delta.m_backend;
LAB_005be45e:
    do {
      do {
        pnVar29 = val;
        pcVar28 = &local_ac8;
        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
          (((cpp_dec_float<200U,_int,_void> *)&pcVar28->data)->data)._M_elems[0] =
               (pnVar29->m_backend).data._M_elems[0];
          pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar29 + ((ulong)bVar35 * -2 + 1) * 4);
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + ((ulong)bVar35 * -2 + 1) * 4)
          ;
        }
        local_ac8.exp = (val->m_backend).exp;
        local_ac8.neg = (val->m_backend).neg;
        local_ac8.fpclass = (val->m_backend).fpclass;
        local_ac8.prec_elem = (val->m_backend).prec_elem;
        iVar20 = (*(this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._vptr_SPxRatioTester[3])(this);
        (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar20) + 0x368))
                  (&result_4.m_backend,(long *)CONCAT44(extraout_var_10,iVar20));
        pcVar28 = &result_4.m_backend;
        pcVar31 = &local_9b8;
        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
          (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
          pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4);
        }
        local_9b8.exp = result_4.m_backend.exp;
        local_9b8.neg = result_4.m_backend.neg;
        local_9b8.fpclass = result_4.m_backend.fpclass;
        local_9b8.prec_elem = result_4.m_backend.prec_elem;
        maxDelta(this,&rmaxabs,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_ac8,*(int *)(lVar27 + 0xa0),*(int **)(lVar27 + 0xa8),
                 *(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   **)(lVar27 + 0xb8),
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)*plVar5,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)*local_e88,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)*local_e80);
        maxDelta(this,&cmaxabs,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_ac8,*(int *)(lVar7 + 0xa0),*(int **)(lVar7 + 0xa8),
                 *(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   **)(lVar7 + 0xb8),
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)*plVar6,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)*plVar9,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)*plVar8);
        if (((local_ac8.fpclass != cpp_dec_float_NaN) &&
            ((val->m_backend).fpclass != cpp_dec_float_NaN)) &&
           (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&local_ac8,&val->m_backend), iVar20 == 0)) {
          return (SPxId)enterId.super_DataKey;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(&local_cd8,0);
        ::soplex::infinity::__tls_init();
        result_4.m_backend.fpclass = cpp_dec_float_finite;
        result_4.m_backend.prec_elem = 0x1c;
        result_4.m_backend.data._M_elems[0] = 0;
        result_4.m_backend.data._M_elems[1] = 0;
        result_4.m_backend.data._M_elems[2] = 0;
        result_4.m_backend.data._M_elems[3] = 0;
        result_4.m_backend.data._M_elems[4] = 0;
        result_4.m_backend.data._M_elems[5] = 0;
        result_4.m_backend.data._M_elems[6] = 0;
        result_4.m_backend.data._M_elems[7] = 0;
        result_4.m_backend.data._M_elems[8] = 0;
        result_4.m_backend.data._M_elems[9] = 0;
        result_4.m_backend.data._M_elems[10] = 0;
        result_4.m_backend.data._M_elems[0xb] = 0;
        result_4.m_backend.data._M_elems[0xc] = 0;
        result_4.m_backend.data._M_elems[0xd] = 0;
        result_4.m_backend.data._M_elems[0xe] = 0;
        result_4.m_backend.data._M_elems[0xf] = 0;
        result_4.m_backend.data._M_elems[0x10] = 0;
        result_4.m_backend.data._M_elems[0x11] = 0;
        result_4.m_backend.data._M_elems[0x12] = 0;
        result_4.m_backend.data._M_elems[0x13] = 0;
        result_4.m_backend.data._M_elems[0x14] = 0;
        result_4.m_backend.data._M_elems[0x15] = 0;
        result_4.m_backend.data._M_elems[0x16] = 0;
        result_4.m_backend.data._M_elems[0x17] = 0;
        result_4.m_backend.data._M_elems[0x18] = 0;
        result_4.m_backend.data._M_elems[0x19] = 0;
        result_4.m_backend.data._M_elems._104_5_ = 0;
        result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_4.m_backend.exp = 0;
        result_4.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&result_4.m_backend,local_a48);
        pcVar28 = &result_4.m_backend;
        pcVar31 = &local_d58;
        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
          (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
          pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4);
        }
        local_d58.exp = result_4.m_backend.exp;
        local_d58.neg = result_4.m_backend.neg;
        local_d58.fpclass = result_4.m_backend.fpclass;
        local_d58.prec_elem = result_4.m_backend.prec_elem;
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 0x1c;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems[6] = 0;
        result.m_backend.data._M_elems[7] = 0;
        result.m_backend.data._M_elems[8] = 0;
        result.m_backend.data._M_elems[9] = 0;
        result.m_backend.data._M_elems[10] = 0;
        result.m_backend.data._M_elems[0xb] = 0;
        result.m_backend.data._M_elems[0xc] = 0;
        result.m_backend.data._M_elems[0xd] = 0;
        result.m_backend.data._M_elems[0xe] = 0;
        result.m_backend.data._M_elems[0xf] = 0;
        result.m_backend.data._M_elems[0x10] = 0;
        result.m_backend.data._M_elems[0x11] = 0;
        result.m_backend.data._M_elems[0x12] = 0;
        result.m_backend.data._M_elems[0x13] = 0;
        result.m_backend.data._M_elems[0x14] = 0;
        result.m_backend.data._M_elems[0x15] = 0;
        result.m_backend.data._M_elems[0x16] = 0;
        result.m_backend.data._M_elems[0x17] = 0;
        result.m_backend.data._M_elems[0x18] = 0;
        result.m_backend.data._M_elems[0x19] = 0;
        result.m_backend.data._M_elems._104_5_ = 0;
        result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        result_4.m_backend.fpclass = cpp_dec_float_finite;
        result_4.m_backend.prec_elem = 0x1c;
        result_4.m_backend.data._M_elems._0_16_ = ZEXT816(0);
        result_4.m_backend.data._M_elems._16_16_ = ZEXT816(0);
        result_4.m_backend.data._M_elems._32_16_ = ZEXT816(0);
        result_4.m_backend.data._M_elems._48_16_ = ZEXT816(0);
        result_4.m_backend.data._M_elems._64_16_ = ZEXT816(0);
        result_4.m_backend.data._M_elems._80_16_ = ZEXT816(0);
        result_4.m_backend.data._M_elems[0x18] = 0;
        result_4.m_backend.data._M_elems[0x19] = 0;
        result_4.m_backend.data._M_elems._104_5_ = 0;
        result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_4.m_backend.exp = 0;
        result_4.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&result_4.m_backend,0.001);
        pnVar29 = &rmaxabs;
        pcVar28 = &result.m_backend;
        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
          (pcVar28->data)._M_elems[0] = (pnVar29->m_backend).data._M_elems[0];
          pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar29 + ((ulong)bVar35 * -2 + 1) * 4);
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
        }
        result.m_backend.exp = rmaxabs.m_backend.exp;
        result.m_backend.neg = rmaxabs.m_backend.neg;
        result.m_backend.fpclass = rmaxabs.m_backend.fpclass;
        result.m_backend.prec_elem = rmaxabs.m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&result.m_backend,&result_4.m_backend);
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x1c;
        result_1.m_backend.neg = false;
        result_1.m_backend.exp = 0;
        pcVar28 = &result.m_backend;
        pcVar31 = &result_1.m_backend;
        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
          (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
          pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4);
        }
        result_1.m_backend.exp = result.m_backend.exp;
        result_1.m_backend.neg = result.m_backend.neg;
        result_1.m_backend.fpclass = result.m_backend.fpclass;
        result_1.m_backend.prec_elem = result.m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&result_1.m_backend,&epsilon.m_backend);
        pcVar28 = &result_1.m_backend;
        pcVar31 = &local_bc8;
        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
          (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
          pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4);
        }
        local_bc8.exp = result_1.m_backend.exp;
        local_bc8.neg = result_1.m_backend.neg;
        local_bc8.fpclass = result_1.m_backend.fpclass;
        local_bc8.prec_elem = result_1.m_backend.prec_elem;
        if (((result_1.m_backend.fpclass != cpp_dec_float_NaN) &&
            (epsilon.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&local_bc8,&epsilon.m_backend), iVar20 < 0)) {
          pcVar28 = &epsilon.m_backend;
          pcVar31 = &local_bc8;
          for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
            (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
            pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
            pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4);
          }
          local_bc8.exp = epsilon.m_backend.exp;
          local_bc8.neg = epsilon.m_backend.neg;
          local_bc8.fpclass = epsilon.m_backend.fpclass;
          local_bc8.prec_elem = epsilon.m_backend.prec_elem;
        }
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 0x1c;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems[6] = 0;
        result.m_backend.data._M_elems[7] = 0;
        result.m_backend.data._M_elems[8] = 0;
        result.m_backend.data._M_elems[9] = 0;
        result.m_backend.data._M_elems[10] = 0;
        result.m_backend.data._M_elems[0xb] = 0;
        result.m_backend.data._M_elems[0xc] = 0;
        result.m_backend.data._M_elems[0xd] = 0;
        result.m_backend.data._M_elems[0xe] = 0;
        result.m_backend.data._M_elems[0xf] = 0;
        result.m_backend.data._M_elems[0x10] = 0;
        result.m_backend.data._M_elems[0x11] = 0;
        result.m_backend.data._M_elems[0x12] = 0;
        result.m_backend.data._M_elems[0x13] = 0;
        result.m_backend.data._M_elems[0x14] = 0;
        result.m_backend.data._M_elems[0x15] = 0;
        result.m_backend.data._M_elems[0x16] = 0;
        result.m_backend.data._M_elems[0x17] = 0;
        result.m_backend.data._M_elems[0x18] = 0;
        result.m_backend.data._M_elems[0x19] = 0;
        result.m_backend.data._M_elems._104_5_ = 0;
        result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        result_4.m_backend.fpclass = cpp_dec_float_finite;
        result_4.m_backend.prec_elem = 0x1c;
        result_4.m_backend.data._M_elems._0_16_ = ZEXT816(0);
        result_4.m_backend.data._M_elems._16_16_ = ZEXT816(0);
        result_4.m_backend.data._M_elems._32_16_ = ZEXT816(0);
        result_4.m_backend.data._M_elems._48_16_ = ZEXT816(0);
        result_4.m_backend.data._M_elems._64_16_ = ZEXT816(0);
        result_4.m_backend.data._M_elems._80_16_ = ZEXT816(0);
        result_4.m_backend.data._M_elems[0x18] = 0;
        result_4.m_backend.data._M_elems[0x19] = 0;
        result_4.m_backend.data._M_elems._104_5_ = 0;
        result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_4.m_backend.exp = 0;
        result_4.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&result_4.m_backend,0.001);
        pnVar29 = &cmaxabs;
        pcVar28 = &result.m_backend;
        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
          (pcVar28->data)._M_elems[0] = (pnVar29->m_backend).data._M_elems[0];
          pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar29 + ((ulong)bVar35 * -2 + 1) * 4);
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
        }
        result.m_backend.exp = cmaxabs.m_backend.exp;
        result.m_backend.neg = cmaxabs.m_backend.neg;
        result.m_backend.fpclass = cmaxabs.m_backend.fpclass;
        result.m_backend.prec_elem = cmaxabs.m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&result.m_backend,&result_4.m_backend);
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x1c;
        result_1.m_backend.neg = false;
        result_1.m_backend.exp = 0;
        pcVar28 = &result.m_backend;
        pcVar31 = &result_1.m_backend;
        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
          (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
          pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4);
        }
        result_1.m_backend.exp = result.m_backend.exp;
        result_1.m_backend.neg = result.m_backend.neg;
        result_1.m_backend.fpclass = result.m_backend.fpclass;
        result_1.m_backend.prec_elem = result.m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&result_1.m_backend,&epsilon.m_backend);
        pcVar28 = &result_1.m_backend;
        pcVar31 = &local_b48;
        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
          (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
          pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4);
        }
        local_b48.exp = result_1.m_backend.exp;
        local_b48.neg = result_1.m_backend.neg;
        local_b48.fpclass = result_1.m_backend.fpclass;
        local_b48.prec_elem = result_1.m_backend.prec_elem;
        if (((result_1.m_backend.fpclass != cpp_dec_float_NaN) &&
            (epsilon.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&local_b48,&epsilon.m_backend), iVar20 < 0)) {
          pcVar28 = &epsilon.m_backend;
          pcVar31 = &local_b48;
          for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
            (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
            pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
            pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4);
          }
          local_b48.exp = epsilon.m_backend.exp;
          local_b48.neg = epsilon.m_backend.neg;
          local_b48.fpclass = epsilon.m_backend.fpclass;
          local_b48.prec_elem = epsilon.m_backend.prec_elem;
        }
        local_f44 = 0xffffffff;
        local_fd4 = 0xffffffff;
        if (0 < (long)*(int *)(lVar27 + 0xa0)) {
          lVar24 = (long)*(int *)(lVar27 + 0xa0) + 1;
          local_fd4 = 0xffffffff;
          do {
            lVar26 = *(long *)(lVar27 + 0xb8);
            uVar3 = *(uint *)(*(long *)(lVar27 + 0xa8) + -8 + lVar24 * 4);
            lVar34 = (long)(int)uVar3 * 0x80;
            iVar20 = *(int *)(lVar26 + 0x70 + lVar34);
            bVar2 = *(byte *)(lVar26 + 0x74 + lVar34);
            uVar10 = *(undefined8 *)(lVar26 + 0x78 + lVar34);
            memmove(&local_f08,(void *)(lVar26 + lVar34),0x70);
            local_f08.exp = iVar20;
            local_f08.neg = (bool)bVar2;
            local_f08.fpclass = (fpclass_type)uVar10;
            local_f08.prec_elem = SUB84(uVar10,4);
            if ((((fpclass_type)uVar10 == cpp_dec_float_NaN) ||
                (local_bc8.fpclass == cpp_dec_float_NaN)) ||
               (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_f08,&local_bc8), iVar20 < 1)) {
              pcVar28 = &local_bc8;
              pcVar31 = &result_4.m_backend;
              for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4)
                ;
                pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4)
                ;
              }
              result_4.m_backend.exp = local_bc8.exp;
              result_4.m_backend.neg = local_bc8.neg;
              result_4.m_backend.fpclass = local_bc8.fpclass;
              result_4.m_backend.prec_elem = local_bc8.prec_elem;
              if (result_4.m_backend.data._M_elems[0] != 0 ||
                  local_bc8.fpclass != cpp_dec_float_finite) {
                result_4.m_backend.neg = (bool)(local_bc8.neg ^ 1);
              }
              if (((local_bc8.fpclass == cpp_dec_float_NaN) ||
                  (local_f08.fpclass == cpp_dec_float_NaN)) ||
                 (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     (&local_f08,&result_4.m_backend), -1 < iVar20)) {
                lVar26 = *(long *)(lVar27 + 0xa8);
                lVar34 = *(long *)(lVar27 + 0xb8);
                lVar25 = (long)*(int *)(lVar26 + -8 + lVar24 * 4) * 0x80;
                *(undefined8 *)(lVar34 + 0x78 + lVar25) = 0x1c00000000;
                *(undefined1 (*) [16])(lVar34 + lVar25) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(lVar34 + 0x10 + lVar25) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(lVar34 + 0x20 + lVar25) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(lVar34 + 0x30 + lVar25) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(lVar34 + 0x40 + lVar25) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(lVar34 + 0x50 + lVar25) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(lVar34 + 0x60 + lVar25) = (undefined1  [16])0x0;
                *(undefined8 *)(lVar34 + 0x6d + lVar25) = 0;
                iVar20 = *(int *)(lVar27 + 0xa0);
                *(int *)(lVar27 + 0xa0) = iVar20 + -1;
                *(undefined4 *)(lVar26 + -8 + lVar24 * 4) =
                     *(undefined4 *)(lVar26 + -4 + (long)iVar20 * 4);
                uVar10 = result_4.m_backend._120_8_;
              }
              else {
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)(*local_e88 + lVar34);
                lVar26 = *plVar5;
                result_4.m_backend.fpclass = cpp_dec_float_finite;
                result_4.m_backend.prec_elem = 0x1c;
                result_4.m_backend.data._M_elems[0] = 0;
                result_4.m_backend.data._M_elems[1] = 0;
                result_4.m_backend.data._M_elems[2] = 0;
                result_4.m_backend.data._M_elems[3] = 0;
                result_4.m_backend.data._M_elems[4] = 0;
                result_4.m_backend.data._M_elems[5] = 0;
                result_4.m_backend.data._M_elems[6] = 0;
                result_4.m_backend.data._M_elems[7] = 0;
                result_4.m_backend.data._M_elems[8] = 0;
                result_4.m_backend.data._M_elems[9] = 0;
                result_4.m_backend.data._M_elems[10] = 0;
                result_4.m_backend.data._M_elems[0xb] = 0;
                result_4.m_backend.data._M_elems[0xc] = 0;
                result_4.m_backend.data._M_elems[0xd] = 0;
                result_4.m_backend.data._M_elems[0xe] = 0;
                result_4.m_backend.data._M_elems[0xf] = 0;
                result_4.m_backend.data._M_elems[0x10] = 0;
                result_4.m_backend.data._M_elems[0x11] = 0;
                result_4.m_backend.data._M_elems[0x12] = 0;
                result_4.m_backend.data._M_elems[0x13] = 0;
                result_4.m_backend.data._M_elems[0x14] = 0;
                result_4.m_backend.data._M_elems[0x15] = 0;
                result_4.m_backend.data._M_elems[0x16] = 0;
                result_4.m_backend.data._M_elems[0x17] = 0;
                result_4.m_backend.data._M_elems[0x18] = 0;
                result_4.m_backend.data._M_elems[0x19] = 0;
                result_4.m_backend.data._M_elems._104_5_ = 0;
                result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                result_4.m_backend.exp = 0;
                result_4.m_backend.neg = false;
                if (&result_4.m_backend == (cpp_dec_float<200U,_int,_void> *)(lVar26 + lVar34)) {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            (&result_4.m_backend,pcVar28);
                  if (result_4.m_backend.data._M_elems[0] != 0 ||
                      result_4.m_backend.fpclass != cpp_dec_float_finite) {
                    result_4.m_backend.neg = (bool)(result_4.m_backend.neg ^ 1);
                  }
                }
                else {
                  if (&result_4.m_backend != pcVar28) {
                    pcVar31 = pcVar28;
                    pcVar23 = &result_4.m_backend;
                    for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                      (pcVar23->data)._M_elems[0] = (pcVar31->data)._M_elems[0];
                      pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                      pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar23 + (ulong)bVar35 * -8 + 4);
                    }
                    result_4.m_backend.exp = pcVar28->exp;
                    result_4.m_backend.neg = pcVar28->neg;
                    result_4.m_backend.fpclass = pcVar28->fpclass;
                    result_4.m_backend.prec_elem = pcVar28->prec_elem;
                  }
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            (&result_4.m_backend,(cpp_dec_float<200U,_int,_void> *)(lVar26 + lVar34)
                            );
                }
                pcVar28 = &result_4.m_backend;
                pcVar31 = &local_e78;
                for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                  (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                  pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                }
                local_e78.exp = result_4.m_backend.exp;
                local_e78.neg = result_4.m_backend.neg;
                local_e78.fpclass = result_4.m_backend.fpclass;
                local_e78.prec_elem = result_4.m_backend.prec_elem;
                if (((result_4.m_backend.fpclass == cpp_dec_float_NaN) ||
                    (degeneps.m_backend.fpclass == cpp_dec_float_NaN)) ||
                   (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                             compare(&local_e78,&degeneps.m_backend), iVar20 < 1)) {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                            (&local_e78,&local_f08);
                  uVar10 = result_4.m_backend._120_8_;
                  if (((local_e78.fpclass != cpp_dec_float_NaN) &&
                      (local_ac8.fpclass != cpp_dec_float_NaN)) &&
                     (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                               compare(&local_e78,&local_ac8), uVar10 = result_4.m_backend._120_8_,
                     iVar20 < 1)) {
                    pcVar28 = &local_f08;
                    pcVar31 = &result_4.m_backend;
                    for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                      (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                      pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                      pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                    }
                    result_4.m_backend.exp = local_f08.exp;
                    result_4.m_backend.neg = local_f08.neg;
                    uVar10._0_4_ = local_f08.fpclass;
                    uVar10._4_4_ = local_f08.prec_elem;
                    result_4.m_backend.fpclass = local_f08.fpclass;
                    result_4.m_backend.prec_elem = local_f08.prec_elem;
                    if (result_4.m_backend.data._M_elems[0] != 0 ||
                        local_f08.fpclass != cpp_dec_float_finite) {
                      result_4.m_backend.neg = (bool)(local_f08.neg ^ 1);
                    }
                    if (((local_f08.fpclass != cpp_dec_float_NaN) &&
                        (uVar10 = result_4.m_backend._120_8_, local_cd8.fpclass != cpp_dec_float_NaN
                        )) && (iVar20 = boost::multiprecision::backends::
                                        cpp_dec_float<200U,_int,_void>::compare
                                                  (&result_4.m_backend,&local_cd8),
                              uVar10 = result_4.m_backend._120_8_, -1 < iVar20)) {
                      iVar20 = (*(this->
                                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._vptr_SPxRatioTester[3])();
                      enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT44(extraout_var_14,iVar20),uVar3);
                      pcVar28 = &local_e78;
                      pcVar31 = &local_d58;
                      for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                        (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                        pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                        pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                      }
                      local_d58.exp = local_e78.exp;
                      local_d58.neg = local_e78.neg;
                      local_d58.fpclass = local_e78.fpclass;
                      local_d58.prec_elem = local_e78.prec_elem;
                      puVar30 = local_f08.data._M_elems + 1;
                      puVar33 = local_cd8.data._M_elems + 1;
                      for (lVar26 = 0x1b; lVar26 != 0; lVar26 = lVar26 + -1) {
                        *puVar33 = *puVar30;
                        puVar30 = puVar30 + (ulong)bVar35 * -2 + 1;
                        puVar33 = puVar33 + (ulong)bVar35 * -2 + 1;
                      }
                      local_cd8.data._M_elems[0] = local_f08.data._M_elems[0];
                      local_cd8.neg =
                           (bool)((local_f08.data._M_elems[0] != 0 ||
                                  local_f08.fpclass != cpp_dec_float_finite) ^ local_f08.neg);
                      local_fd4 = uVar3;
                      uVar10 = result_4.m_backend._120_8_;
                      local_d58._120_8_ = local_e78._120_8_;
                      local_cd8.exp = local_f08.exp;
                      local_cd8._120_8_ = local_f08._120_8_;
                    }
                  }
                }
                else {
                  iVar20 = (*(this->
                             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._vptr_SPxRatioTester[3])();
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)(lVar34 + *plVar5);
                  local_740._0_4_ = cpp_dec_float_finite;
                  local_740._4_4_ = 0x1c;
                  local_758 = SUB1613((undefined1  [16])0x0,0);
                  local_768 = (undefined1  [16])0x0;
                  local_778 = (undefined1  [16])0x0;
                  local_788 = (undefined1  [16])0x0;
                  local_798 = (undefined1  [16])0x0;
                  local_7a8 = (undefined1  [16])0x0;
                  local_7b8 = (undefined1  [16])0x0;
                  uStack_74b = 0;
                  iStack_748 = 0;
                  bStack_744 = false;
                  if ((cpp_dec_float<200U,_int,_void> *)local_7b8 != pcVar28) {
                    pcVar31 = pcVar28;
                    pcVar23 = (cpp_dec_float<200U,_int,_void> *)local_7b8;
                    for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                      (pcVar23->data)._M_elems[0] = (pcVar31->data)._M_elems[0];
                      pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                      pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar23 + (ulong)bVar35 * -8 + 4);
                    }
                    iStack_748 = pcVar28->exp;
                    bStack_744 = pcVar28->neg;
                    local_740._0_4_ = pcVar28->fpclass;
                    local_740._4_4_ = pcVar28->prec_elem;
                  }
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                            ((cpp_dec_float<200U,_int,_void> *)local_7b8,&degeneps.m_backend);
                  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::shiftLPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT44(extraout_var_13,iVar20),uVar3,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)local_7b8);
                  uVar10 = result_4.m_backend._120_8_;
                }
              }
            }
            else {
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)(*local_e80 + lVar34);
              lVar26 = *plVar5;
              result_4.m_backend.fpclass = cpp_dec_float_finite;
              result_4.m_backend.prec_elem = 0x1c;
              result_4.m_backend.data._M_elems[0] = 0;
              result_4.m_backend.data._M_elems[1] = 0;
              result_4.m_backend.data._M_elems[2] = 0;
              result_4.m_backend.data._M_elems[3] = 0;
              result_4.m_backend.data._M_elems[4] = 0;
              result_4.m_backend.data._M_elems[5] = 0;
              result_4.m_backend.data._M_elems[6] = 0;
              result_4.m_backend.data._M_elems[7] = 0;
              result_4.m_backend.data._M_elems[8] = 0;
              result_4.m_backend.data._M_elems[9] = 0;
              result_4.m_backend.data._M_elems[10] = 0;
              result_4.m_backend.data._M_elems[0xb] = 0;
              result_4.m_backend.data._M_elems[0xc] = 0;
              result_4.m_backend.data._M_elems[0xd] = 0;
              result_4.m_backend.data._M_elems[0xe] = 0;
              result_4.m_backend.data._M_elems[0xf] = 0;
              result_4.m_backend.data._M_elems[0x10] = 0;
              result_4.m_backend.data._M_elems[0x11] = 0;
              result_4.m_backend.data._M_elems[0x12] = 0;
              result_4.m_backend.data._M_elems[0x13] = 0;
              result_4.m_backend.data._M_elems[0x14] = 0;
              result_4.m_backend.data._M_elems[0x15] = 0;
              result_4.m_backend.data._M_elems[0x16] = 0;
              result_4.m_backend.data._M_elems[0x17] = 0;
              result_4.m_backend.data._M_elems[0x18] = 0;
              result_4.m_backend.data._M_elems[0x19] = 0;
              result_4.m_backend.data._M_elems._104_5_ = 0;
              result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result_4.m_backend.exp = 0;
              result_4.m_backend.neg = false;
              if (&result_4.m_backend == (cpp_dec_float<200U,_int,_void> *)(lVar26 + lVar34)) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          (&result_4.m_backend,pcVar28);
                if (result_4.m_backend.data._M_elems[0] != 0 ||
                    result_4.m_backend.fpclass != cpp_dec_float_finite) {
                  result_4.m_backend.neg = (bool)(result_4.m_backend.neg ^ 1);
                }
              }
              else {
                if (&result_4.m_backend != pcVar28) {
                  pcVar31 = pcVar28;
                  pcVar23 = &result_4.m_backend;
                  for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                    (pcVar23->data)._M_elems[0] = (pcVar31->data)._M_elems[0];
                    pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                    pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar23 + (ulong)bVar35 * -8 + 4);
                  }
                  result_4.m_backend.exp = pcVar28->exp;
                  result_4.m_backend.neg = pcVar28->neg;
                  result_4.m_backend.fpclass = pcVar28->fpclass;
                  result_4.m_backend.prec_elem = pcVar28->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          (&result_4.m_backend,(cpp_dec_float<200U,_int,_void> *)(lVar26 + lVar34));
              }
              pcVar28 = &result_4.m_backend;
              pcVar31 = &local_e78;
              for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4)
                ;
                pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4)
                ;
              }
              local_e78.exp = result_4.m_backend.exp;
              local_e78.neg = result_4.m_backend.neg;
              local_e78.fpclass = result_4.m_backend.fpclass;
              local_e78.prec_elem = result_4.m_backend.prec_elem;
              pnVar29 = &degeneps;
              pcVar28 = &result_4.m_backend;
              for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                (pcVar28->data)._M_elems[0] = (pnVar29->m_backend).data._M_elems[0];
                pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar29 + ((ulong)bVar35 * -2 + 1) * 4);
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4)
                ;
              }
              result_4.m_backend.exp = degeneps.m_backend.exp;
              result_4.m_backend.neg = degeneps.m_backend.neg;
              uVar11._4_4_ = degeneps.m_backend.prec_elem;
              uVar11._0_4_ = degeneps.m_backend.fpclass;
              if (result_4.m_backend.data._M_elems[0] != 0 ||
                  degeneps.m_backend.fpclass != cpp_dec_float_finite) {
                result_4.m_backend.neg = (bool)(degeneps.m_backend.neg ^ 1);
              }
              fVar21 = result_4.m_backend.fpclass;
              result_4.m_backend._120_8_ = uVar11;
              if ((degeneps.m_backend.fpclass == cpp_dec_float_NaN || fVar21 == cpp_dec_float_NaN)
                 || (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              compare(&local_e78,&result_4.m_backend), -1 < iVar20)) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                          (&local_e78,&local_f08);
                uVar10 = result_4.m_backend._120_8_;
                if ((local_e78.fpclass != cpp_dec_float_NaN) &&
                   ((((local_ac8.fpclass != cpp_dec_float_NaN &&
                      (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                compare(&local_e78,&local_ac8), uVar10 = result_4.m_backend._120_8_,
                      iVar20 < 1)) && (local_f08.fpclass != cpp_dec_float_NaN)) &&
                    ((local_cd8.fpclass != cpp_dec_float_NaN &&
                     (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                               compare(&local_f08,&local_cd8), uVar10 = result_4.m_backend._120_8_,
                     -1 < iVar20)))))) {
                  iVar20 = (*(this->
                             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._vptr_SPxRatioTester[3])();
                  enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT44(extraout_var_11,iVar20),uVar3);
                  pcVar28 = &local_e78;
                  pcVar31 = &local_d58;
                  for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                    (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                    pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                    pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                  }
                  local_d58.exp = local_e78.exp;
                  local_d58.neg = local_e78.neg;
                  local_d58.fpclass = local_e78.fpclass;
                  local_d58.prec_elem = local_e78.prec_elem;
                  pcVar28 = &local_f08;
                  pcVar31 = &local_cd8;
                  for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                    (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                    pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                    pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                  }
                  local_cd8.neg = local_f08.neg;
                  local_fd4 = uVar3;
                  uVar10 = result_4.m_backend._120_8_;
                  local_d58._120_8_ = local_e78._120_8_;
                  local_cd8.exp = local_f08.exp;
                  local_cd8._120_8_ = local_f08._120_8_;
                }
              }
              else {
                iVar20 = (*(this->
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           )._vptr_SPxRatioTester[3])();
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)(lVar34 + *plVar5);
                local_6c0._0_4_ = cpp_dec_float_finite;
                local_6c0._4_4_ = 0x1c;
                local_6d8 = SUB1613((undefined1  [16])0x0,0);
                local_6e8 = (undefined1  [16])0x0;
                local_6f8 = (undefined1  [16])0x0;
                local_708 = (undefined1  [16])0x0;
                local_718 = (undefined1  [16])0x0;
                local_728 = (undefined1  [16])0x0;
                local_738 = (undefined1  [16])0x0;
                uStack_6cb = 0;
                iStack_6c8 = 0;
                bStack_6c4 = false;
                if ((cpp_dec_float<200U,_int,_void> *)local_738 != pcVar28) {
                  pcVar31 = pcVar28;
                  pcVar23 = (cpp_dec_float<200U,_int,_void> *)local_738;
                  for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                    (pcVar23->data)._M_elems[0] = (pcVar31->data)._M_elems[0];
                    pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                    pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar23 + (ulong)bVar35 * -8 + 4);
                  }
                  iStack_6c8 = pcVar28->exp;
                  bStack_6c4 = pcVar28->neg;
                  local_6c0._0_4_ = pcVar28->fpclass;
                  local_6c0._4_4_ = pcVar28->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_738,&degeneps.m_backend);
                SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::shiftUPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(extraout_var_12,iVar20),uVar3,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)local_738);
                uVar10 = result_4.m_backend._120_8_;
              }
            }
            result_4.m_backend._120_8_ = uVar10;
            lVar24 = lVar24 + -1;
          } while (1 < lVar24);
        }
        if (0 < (long)*(int *)(lVar7 + 0xa0)) {
          local_f44 = 0xffffffff;
          lVar24 = (long)*(int *)(lVar7 + 0xa0);
          do {
            lVar26 = *(long *)(lVar7 + 0xb8);
            iVar20 = *(int *)(*(long *)(lVar7 + 0xa8) + -4 + lVar24 * 4);
            lVar34 = (long)iVar20 * 0x80;
            iVar22 = *(int *)(lVar26 + 0x70 + lVar34);
            bVar2 = *(byte *)(lVar26 + 0x74 + lVar34);
            uVar10 = *(undefined8 *)(lVar26 + 0x78 + lVar34);
            memmove(&local_f08,(void *)(lVar26 + lVar34),0x70);
            local_f08.exp = iVar22;
            local_f08.neg = (bool)bVar2;
            local_f08.fpclass = (fpclass_type)uVar10;
            local_f08.prec_elem = SUB84(uVar10,4);
            if ((((fpclass_type)uVar10 == cpp_dec_float_NaN) ||
                (local_b48.fpclass == cpp_dec_float_NaN)) ||
               (iVar22 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_f08,&local_b48), iVar22 < 1)) {
              pcVar28 = &local_b48;
              pcVar31 = &result_4.m_backend;
              for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4)
                ;
                pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4)
                ;
              }
              result_4.m_backend.exp = local_b48.exp;
              result_4.m_backend.neg = local_b48.neg;
              result_4.m_backend.fpclass = local_b48.fpclass;
              result_4.m_backend.prec_elem = local_b48.prec_elem;
              if (result_4.m_backend.data._M_elems[0] != 0 ||
                  local_b48.fpclass != cpp_dec_float_finite) {
                result_4.m_backend.neg = (bool)(local_b48.neg ^ 1);
              }
              if (((local_b48.fpclass == cpp_dec_float_NaN) ||
                  (local_f08.fpclass == cpp_dec_float_NaN)) ||
                 (iVar22 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     (&local_f08,&result_4.m_backend), -1 < iVar22)) {
                lVar26 = *(long *)(lVar7 + 0xa8);
                lVar34 = *(long *)(lVar7 + 0xb8);
                lVar25 = (long)*(int *)(lVar26 + -4 + lVar24 * 4) * 0x80;
                *(undefined8 *)(lVar34 + 0x78 + lVar25) = 0x1c00000000;
                *(undefined1 (*) [16])(lVar34 + lVar25) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(lVar34 + 0x10 + lVar25) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(lVar34 + 0x20 + lVar25) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(lVar34 + 0x30 + lVar25) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(lVar34 + 0x40 + lVar25) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(lVar34 + 0x50 + lVar25) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(lVar34 + 0x60 + lVar25) = (undefined1  [16])0x0;
                *(undefined8 *)(lVar34 + 0x6d + lVar25) = 0;
                iVar20 = *(int *)(lVar7 + 0xa0);
                *(int *)(lVar7 + 0xa0) = iVar20 + -1;
                *(undefined4 *)(lVar26 + -4 + lVar24 * 4) =
                     *(undefined4 *)(lVar26 + -4 + (long)iVar20 * 4);
                uVar18 = result_4.m_backend._120_8_;
              }
              else {
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)(*plVar9 + lVar34);
                lVar26 = *plVar6;
                result_4.m_backend.fpclass = cpp_dec_float_finite;
                result_4.m_backend.prec_elem = 0x1c;
                result_4.m_backend.data._M_elems[0] = 0;
                result_4.m_backend.data._M_elems[1] = 0;
                result_4.m_backend.data._M_elems[2] = 0;
                result_4.m_backend.data._M_elems[3] = 0;
                result_4.m_backend.data._M_elems[4] = 0;
                result_4.m_backend.data._M_elems[5] = 0;
                result_4.m_backend.data._M_elems[6] = 0;
                result_4.m_backend.data._M_elems[7] = 0;
                result_4.m_backend.data._M_elems[8] = 0;
                result_4.m_backend.data._M_elems[9] = 0;
                result_4.m_backend.data._M_elems[10] = 0;
                result_4.m_backend.data._M_elems[0xb] = 0;
                result_4.m_backend.data._M_elems[0xc] = 0;
                result_4.m_backend.data._M_elems[0xd] = 0;
                result_4.m_backend.data._M_elems[0xe] = 0;
                result_4.m_backend.data._M_elems[0xf] = 0;
                result_4.m_backend.data._M_elems[0x10] = 0;
                result_4.m_backend.data._M_elems[0x11] = 0;
                result_4.m_backend.data._M_elems[0x12] = 0;
                result_4.m_backend.data._M_elems[0x13] = 0;
                result_4.m_backend.data._M_elems[0x14] = 0;
                result_4.m_backend.data._M_elems[0x15] = 0;
                result_4.m_backend.data._M_elems[0x16] = 0;
                result_4.m_backend.data._M_elems[0x17] = 0;
                result_4.m_backend.data._M_elems[0x18] = 0;
                result_4.m_backend.data._M_elems[0x19] = 0;
                result_4.m_backend.data._M_elems._104_5_ = 0;
                result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                result_4.m_backend.exp = 0;
                result_4.m_backend.neg = false;
                if (&result_4.m_backend == (cpp_dec_float<200U,_int,_void> *)(lVar26 + lVar34)) {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            (&result_4.m_backend,pcVar28);
                  if (result_4.m_backend.data._M_elems[0] != 0 ||
                      result_4.m_backend.fpclass != cpp_dec_float_finite) {
                    result_4.m_backend.neg = (bool)(result_4.m_backend.neg ^ 1);
                  }
                }
                else {
                  if (&result_4.m_backend != pcVar28) {
                    pcVar31 = pcVar28;
                    pcVar23 = &result_4.m_backend;
                    for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                      (pcVar23->data)._M_elems[0] = (pcVar31->data)._M_elems[0];
                      pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                      pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar23 + (ulong)bVar35 * -8 + 4);
                    }
                    result_4.m_backend.exp = pcVar28->exp;
                    result_4.m_backend.neg = pcVar28->neg;
                    result_4.m_backend.fpclass = pcVar28->fpclass;
                    result_4.m_backend.prec_elem = pcVar28->prec_elem;
                  }
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                            (&result_4.m_backend,(cpp_dec_float<200U,_int,_void> *)(lVar26 + lVar34)
                            );
                }
                pcVar28 = &result_4.m_backend;
                pcVar31 = &local_e78;
                for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                  (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                  pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                }
                local_e78.exp = result_4.m_backend.exp;
                local_e78.neg = result_4.m_backend.neg;
                local_e78.fpclass = result_4.m_backend.fpclass;
                local_e78.prec_elem = result_4.m_backend.prec_elem;
                if (((result_4.m_backend.fpclass == cpp_dec_float_NaN) ||
                    (degeneps.m_backend.fpclass == cpp_dec_float_NaN)) ||
                   (iVar22 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                             compare(&local_e78,&degeneps.m_backend), iVar22 < 1)) {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                            (&local_e78,&local_f08);
                  uVar18 = result_4.m_backend._120_8_;
                  if (((local_e78.fpclass != cpp_dec_float_NaN) &&
                      (local_ac8.fpclass != cpp_dec_float_NaN)) &&
                     (iVar22 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                               compare(&local_e78,&local_ac8), uVar18 = result_4.m_backend._120_8_,
                     iVar22 < 1)) {
                    pcVar28 = &local_f08;
                    pcVar31 = &result_4.m_backend;
                    for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                      (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                      pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                      pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                    }
                    result_4.m_backend.exp = local_f08.exp;
                    result_4.m_backend.neg = local_f08.neg;
                    uVar18._0_4_ = local_f08.fpclass;
                    uVar18._4_4_ = local_f08.prec_elem;
                    result_4.m_backend.fpclass = local_f08.fpclass;
                    result_4.m_backend.prec_elem = local_f08.prec_elem;
                    if (result_4.m_backend.data._M_elems[0] != 0 ||
                        local_f08.fpclass != cpp_dec_float_finite) {
                      result_4.m_backend.neg = (bool)(local_f08.neg ^ 1);
                    }
                    if (((local_f08.fpclass != cpp_dec_float_NaN) &&
                        (uVar18 = result_4.m_backend._120_8_, local_cd8.fpclass != cpp_dec_float_NaN
                        )) && (iVar22 = boost::multiprecision::backends::
                                        cpp_dec_float<200U,_int,_void>::compare
                                                  (&result_4.m_backend,&local_cd8),
                              uVar18 = result_4.m_backend._120_8_, -1 < iVar22)) {
                      iVar22 = (*(this->
                                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._vptr_SPxRatioTester[3])();
                      enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)CONCAT44(extraout_var_18,iVar22),iVar20);
                      pcVar28 = &local_e78;
                      pcVar31 = &local_d58;
                      for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                        (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                        pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                        pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                      }
                      local_d58.exp = local_e78.exp;
                      local_d58.neg = local_e78.neg;
                      local_d58.fpclass = local_e78.fpclass;
                      local_d58.prec_elem = local_e78.prec_elem;
                      puVar30 = local_f08.data._M_elems + 1;
                      puVar33 = local_cd8.data._M_elems + 1;
                      for (lVar26 = 0x1b; lVar26 != 0; lVar26 = lVar26 + -1) {
                        *puVar33 = *puVar30;
                        puVar30 = puVar30 + (ulong)bVar35 * -2 + 1;
                        puVar33 = puVar33 + (ulong)bVar35 * -2 + 1;
                      }
                      local_cd8.data._M_elems[0] = local_f08.data._M_elems[0];
                      local_cd8.neg =
                           (bool)((local_f08.data._M_elems[0] != 0 ||
                                  local_f08.fpclass != cpp_dec_float_finite) ^ local_f08.neg);
                      goto LAB_005bfcad;
                    }
                  }
                }
                else {
                  iVar22 = (*(this->
                             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._vptr_SPxRatioTester[3])();
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)(lVar34 + *plVar6);
                  local_840._0_4_ = cpp_dec_float_finite;
                  local_840._4_4_ = 0x1c;
                  local_858 = SUB1613((undefined1  [16])0x0,0);
                  local_868 = (undefined1  [16])0x0;
                  local_878 = (undefined1  [16])0x0;
                  local_888 = (undefined1  [16])0x0;
                  local_898 = (undefined1  [16])0x0;
                  local_8a8 = (undefined1  [16])0x0;
                  local_8b8 = (undefined1  [16])0x0;
                  uStack_84b = 0;
                  iStack_848 = 0;
                  bStack_844 = false;
                  if ((cpp_dec_float<200U,_int,_void> *)local_8b8 != pcVar28) {
                    pcVar31 = pcVar28;
                    pcVar23 = (cpp_dec_float<200U,_int,_void> *)local_8b8;
                    for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                      (pcVar23->data)._M_elems[0] = (pcVar31->data)._M_elems[0];
                      pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                      pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar23 + (ulong)bVar35 * -8 + 4);
                    }
                    iStack_848 = pcVar28->exp;
                    bStack_844 = pcVar28->neg;
                    local_840._0_4_ = pcVar28->fpclass;
                    local_840._4_4_ = pcVar28->prec_elem;
                  }
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                            ((cpp_dec_float<200U,_int,_void> *)local_8b8,&degeneps.m_backend);
                  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::shiftLCbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT44(extraout_var_17,iVar22),iVar20,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)local_8b8);
                  uVar18 = result_4.m_backend._120_8_;
                }
              }
            }
            else {
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)(*plVar8 + lVar34);
              lVar26 = *plVar6;
              result_4.m_backend.fpclass = cpp_dec_float_finite;
              result_4.m_backend.prec_elem = 0x1c;
              result_4.m_backend.data._M_elems[0] = 0;
              result_4.m_backend.data._M_elems[1] = 0;
              result_4.m_backend.data._M_elems[2] = 0;
              result_4.m_backend.data._M_elems[3] = 0;
              result_4.m_backend.data._M_elems[4] = 0;
              result_4.m_backend.data._M_elems[5] = 0;
              result_4.m_backend.data._M_elems[6] = 0;
              result_4.m_backend.data._M_elems[7] = 0;
              result_4.m_backend.data._M_elems[8] = 0;
              result_4.m_backend.data._M_elems[9] = 0;
              result_4.m_backend.data._M_elems[10] = 0;
              result_4.m_backend.data._M_elems[0xb] = 0;
              result_4.m_backend.data._M_elems[0xc] = 0;
              result_4.m_backend.data._M_elems[0xd] = 0;
              result_4.m_backend.data._M_elems[0xe] = 0;
              result_4.m_backend.data._M_elems[0xf] = 0;
              result_4.m_backend.data._M_elems[0x10] = 0;
              result_4.m_backend.data._M_elems[0x11] = 0;
              result_4.m_backend.data._M_elems[0x12] = 0;
              result_4.m_backend.data._M_elems[0x13] = 0;
              result_4.m_backend.data._M_elems[0x14] = 0;
              result_4.m_backend.data._M_elems[0x15] = 0;
              result_4.m_backend.data._M_elems[0x16] = 0;
              result_4.m_backend.data._M_elems[0x17] = 0;
              result_4.m_backend.data._M_elems[0x18] = 0;
              result_4.m_backend.data._M_elems[0x19] = 0;
              result_4.m_backend.data._M_elems._104_5_ = 0;
              result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result_4.m_backend.exp = 0;
              result_4.m_backend.neg = false;
              if (&result_4.m_backend == (cpp_dec_float<200U,_int,_void> *)(lVar26 + lVar34)) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          (&result_4.m_backend,pcVar28);
                if (result_4.m_backend.data._M_elems[0] != 0 ||
                    result_4.m_backend.fpclass != cpp_dec_float_finite) {
                  result_4.m_backend.neg = (bool)(result_4.m_backend.neg ^ 1);
                }
              }
              else {
                if (&result_4.m_backend != pcVar28) {
                  pcVar31 = pcVar28;
                  pcVar23 = &result_4.m_backend;
                  for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                    (pcVar23->data)._M_elems[0] = (pcVar31->data)._M_elems[0];
                    pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                    pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar23 + (ulong)bVar35 * -8 + 4);
                  }
                  result_4.m_backend.exp = pcVar28->exp;
                  result_4.m_backend.neg = pcVar28->neg;
                  result_4.m_backend.fpclass = pcVar28->fpclass;
                  result_4.m_backend.prec_elem = pcVar28->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          (&result_4.m_backend,(cpp_dec_float<200U,_int,_void> *)(lVar26 + lVar34));
              }
              pcVar28 = &result_4.m_backend;
              pcVar31 = &local_e78;
              for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4)
                ;
                pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4)
                ;
              }
              local_e78.exp = result_4.m_backend.exp;
              local_e78.neg = result_4.m_backend.neg;
              local_e78.fpclass = result_4.m_backend.fpclass;
              local_e78.prec_elem = result_4.m_backend.prec_elem;
              pnVar29 = &degeneps;
              pcVar28 = &result_4.m_backend;
              for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                (pcVar28->data)._M_elems[0] = (pnVar29->m_backend).data._M_elems[0];
                pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar29 + ((ulong)bVar35 * -2 + 1) * 4);
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4)
                ;
              }
              result_4.m_backend.exp = degeneps.m_backend.exp;
              result_4.m_backend.neg = degeneps.m_backend.neg;
              uVar12._4_4_ = degeneps.m_backend.prec_elem;
              uVar12._0_4_ = degeneps.m_backend.fpclass;
              if (result_4.m_backend.data._M_elems[0] != 0 ||
                  degeneps.m_backend.fpclass != cpp_dec_float_finite) {
                result_4.m_backend.neg = (bool)(degeneps.m_backend.neg ^ 1);
              }
              fVar21 = result_4.m_backend.fpclass;
              result_4.m_backend._120_8_ = uVar12;
              if ((degeneps.m_backend.fpclass == cpp_dec_float_NaN || fVar21 == cpp_dec_float_NaN)
                 || (iVar22 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              compare(&local_e78,&result_4.m_backend), -1 < iVar22)) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                          (&local_e78,&local_f08);
                uVar18 = result_4.m_backend._120_8_;
                if ((((local_e78.fpclass != cpp_dec_float_NaN) &&
                     ((local_ac8.fpclass != cpp_dec_float_NaN &&
                      (iVar22 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                compare(&local_e78,&local_ac8), uVar18 = result_4.m_backend._120_8_,
                      iVar22 < 1)))) && (local_f08.fpclass != cpp_dec_float_NaN)) &&
                   ((local_cd8.fpclass != cpp_dec_float_NaN &&
                    (iVar22 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              compare(&local_f08,&local_cd8), uVar18 = result_4.m_backend._120_8_,
                    -1 < iVar22)))) {
                  iVar22 = (*(this->
                             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._vptr_SPxRatioTester[3])();
                  enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(extraout_var_15,iVar22),iVar20);
                  pcVar28 = &local_e78;
                  pcVar31 = &local_d58;
                  for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                    (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                    pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                    pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                  }
                  local_d58.exp = local_e78.exp;
                  local_d58.neg = local_e78.neg;
                  local_d58.fpclass = local_e78.fpclass;
                  local_d58.prec_elem = local_e78.prec_elem;
                  pcVar28 = &local_f08;
                  pcVar31 = &local_cd8;
                  for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                    (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                    pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                    pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                  }
                  local_cd8.neg = local_f08.neg;
LAB_005bfcad:
                  local_f44 = (uint)(lVar24 + -1);
                  uVar18 = result_4.m_backend._120_8_;
                  local_d58.exp = local_e78.exp;
                  local_d58.neg = local_e78.neg;
                  local_d58._120_8_ = local_e78._120_8_;
                  local_cd8.exp = local_f08.exp;
                  local_cd8._120_8_ = local_f08._120_8_;
                }
              }
              else {
                iVar22 = (*(this->
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           )._vptr_SPxRatioTester[3])();
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)(lVar34 + *plVar6);
                local_7c0._0_4_ = cpp_dec_float_finite;
                local_7c0._4_4_ = 0x1c;
                local_7d8 = SUB1613((undefined1  [16])0x0,0);
                local_7e8 = (undefined1  [16])0x0;
                local_7f8 = (undefined1  [16])0x0;
                local_808 = (undefined1  [16])0x0;
                local_818 = (undefined1  [16])0x0;
                local_828 = (undefined1  [16])0x0;
                local_838 = (undefined1  [16])0x0;
                uStack_7cb = 0;
                iStack_7c8 = 0;
                bStack_7c4 = false;
                if ((cpp_dec_float<200U,_int,_void> *)local_838 != pcVar28) {
                  pcVar31 = pcVar28;
                  pcVar23 = (cpp_dec_float<200U,_int,_void> *)local_838;
                  for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                    (pcVar23->data)._M_elems[0] = (pcVar31->data)._M_elems[0];
                    pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                    pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar23 + (ulong)bVar35 * -8 + 4);
                  }
                  iStack_7c8 = pcVar28->exp;
                  bStack_7c4 = pcVar28->neg;
                  local_7c0._0_4_ = pcVar28->fpclass;
                  local_7c0._4_4_ = pcVar28->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_838,&degeneps.m_backend);
                SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::shiftUCbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(extraout_var_16,iVar22),iVar20,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)local_838);
                uVar18 = result_4.m_backend._120_8_;
              }
            }
            result_4.m_backend._120_8_ = uVar18;
            bVar19 = 1 < lVar24;
            lVar24 = lVar24 + -1;
          } while (bVar19);
        }
        iVar20 = (*(this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._vptr_SPxRatioTester[3])();
        (**(code **)(*(long *)CONCAT44(extraout_var_19,iVar20) + 0x368))
                  (&result_4.m_backend,(long *)CONCAT44(extraout_var_19,iVar20));
      } while (((local_9b8.fpclass == cpp_dec_float_NaN) ||
               (result_4.m_backend.fpclass == cpp_dec_float_NaN)) ||
              (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  (&local_9b8,&result_4.m_backend), iVar20 != 0));
      if (-1 < (int)local_f44) {
        iVar20 = (*(this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._vptr_SPxRatioTester[3])();
        bVar19 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(extraout_var_20,iVar20),&enterId);
        if (!bVar19) goto LAB_005c06f3;
        lVar24 = *(long *)(lVar7 + 0xa8);
        lVar26 = *(long *)(lVar7 + 0xb8);
        lVar34 = (long)*(int *)(lVar24 + (ulong)local_f44 * 4) * 0x80;
        *(undefined8 *)(lVar26 + 0x78 + lVar34) = 0x1c00000000;
        *(undefined1 (*) [16])(lVar26 + lVar34) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(lVar26 + 0x10 + lVar34) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(lVar26 + 0x20 + lVar34) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(lVar26 + 0x30 + lVar34) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(lVar26 + 0x40 + lVar34) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(lVar26 + 0x50 + lVar34) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(lVar26 + 0x60 + lVar34) = (undefined1  [16])0x0;
        *(undefined8 *)(lVar26 + 0x6d + lVar34) = 0;
        iVar20 = *(int *)(lVar7 + 0xa0);
        *(int *)(lVar7 + 0xa0) = iVar20 + -1;
        *(undefined4 *)(lVar24 + (ulong)local_f44 * 4) =
             *(undefined4 *)(lVar24 + -4 + (long)iVar20 * 4);
        goto LAB_005be45e;
      }
      if ((int)local_fd4 < 0) goto LAB_005c25ea;
      iVar20 = (*(this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._vptr_SPxRatioTester[3])();
      lVar24 = *(long *)(CONCAT44(extraout_var_21,iVar20) + 0xc58);
      lVar26 = *(long *)(lVar24 + 0x20);
      lVar24 = (long)*(int *)(*(long *)(lVar24 + 0x28) + 4 + (ulong)local_fd4 * 8);
      result_4.m_backend.fpclass = cpp_dec_float_finite;
      result_4.m_backend.prec_elem = 0x1c;
      result_4.m_backend.data._M_elems[0] = 0;
      result_4.m_backend.data._M_elems[1] = 0;
      result_4.m_backend.data._M_elems[2] = 0;
      result_4.m_backend.data._M_elems[3] = 0;
      result_4.m_backend.data._M_elems[4] = 0;
      result_4.m_backend.data._M_elems[5] = 0;
      result_4.m_backend.data._M_elems[6] = 0;
      result_4.m_backend.data._M_elems[7] = 0;
      result_4.m_backend.data._M_elems[8] = 0;
      result_4.m_backend.data._M_elems[9] = 0;
      result_4.m_backend.data._M_elems[10] = 0;
      result_4.m_backend.data._M_elems[0xb] = 0;
      result_4.m_backend.data._M_elems[0xc] = 0;
      result_4.m_backend.data._M_elems[0xd] = 0;
      result_4.m_backend.data._M_elems[0xe] = 0;
      result_4.m_backend.data._M_elems[0xf] = 0;
      result_4.m_backend.data._M_elems[0x10] = 0;
      result_4.m_backend.data._M_elems[0x11] = 0;
      result_4.m_backend.data._M_elems[0x12] = 0;
      result_4.m_backend.data._M_elems[0x13] = 0;
      result_4.m_backend.data._M_elems[0x14] = 0;
      result_4.m_backend.data._M_elems[0x15] = 0;
      result_4.m_backend.data._M_elems[0x16] = 0;
      result_4.m_backend.data._M_elems[0x17] = 0;
      result_4.m_backend.data._M_elems[0x18] = 0;
      result_4.m_backend.data._M_elems[0x19] = 0;
      result_4.m_backend.data._M_elems._104_5_ = 0;
      result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_4.m_backend.exp = 0;
      result_4.m_backend.neg = false;
      iVar20 = *(int *)(lVar26 + 0xc + lVar24 * 0x28);
      if (0 < iVar20) {
        pcVar28 = *(cpp_dec_float<200U,_int,_void> **)(lVar26 + lVar24 * 0x28);
        iVar20 = iVar20 + 1;
        do {
          pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                    ((long)(int)(((cpp_dec_float<200U,_int,_void> *)&pcVar28[1].data)->data).
                                _M_elems[0] * 0x80 + *plVar6);
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems[0xe] = 0;
          result_1.m_backend.data._M_elems[0xf] = 0;
          result_1.m_backend.data._M_elems[0x10] = 0;
          result_1.m_backend.data._M_elems[0x11] = 0;
          result_1.m_backend.data._M_elems[0x12] = 0;
          result_1.m_backend.data._M_elems[0x13] = 0;
          result_1.m_backend.data._M_elems[0x14] = 0;
          result_1.m_backend.data._M_elems[0x15] = 0;
          result_1.m_backend.data._M_elems[0x16] = 0;
          result_1.m_backend.data._M_elems[0x17] = 0;
          result_1.m_backend.data._M_elems[0x18] = 0;
          result_1.m_backend.data._M_elems[0x19] = 0;
          result_1.m_backend.data._M_elems._104_5_ = 0;
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          pcVar31 = pcVar28;
          if ((&result_1.m_backend != pcVar23) &&
             (pcVar31 = pcVar23, pcVar28 != &result_1.m_backend)) {
            pcVar23 = pcVar28;
            pnVar29 = &result_1;
            for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
              (pnVar29->m_backend).data._M_elems[0] =
                   (((cpp_dec_float<200U,_int,_void> *)&pcVar23->data)->data)._M_elems[0];
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar35 * -8 + 4);
              pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar29 + ((ulong)bVar35 * -2 + 1) * 4);
            }
            result_1.m_backend.exp = pcVar28->exp;
            result_1.m_backend.neg = pcVar28->neg;
            result_1.m_backend.fpclass = pcVar28->fpclass;
            result_1.m_backend.prec_elem = pcVar28->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&result_1.m_backend,pcVar31);
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (&result_4.m_backend,&result_1.m_backend);
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                    ((((cpp_dec_float<200U,_int,_void> *)&pcVar28[1].data)->data)._M_elems + 1);
          iVar20 = iVar20 + -1;
        } while (1 < iVar20);
      }
      pcVar28 = &result_4.m_backend;
      pnVar29 = &result_1;
      for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
        (pnVar29->m_backend).data._M_elems[0] = (pcVar28->data)._M_elems[0];
        pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
        pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar29 + ((ulong)bVar35 * -2 + 1) * 4);
      }
      lVar24 = *plVar5;
      lVar34 = (ulong)local_fd4 * 0x80;
      pnVar29 = &result_1;
      puVar30 = (uint *)(lVar24 + lVar34);
      for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
        *puVar30 = (pnVar29->m_backend).data._M_elems[0];
        pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar29 + ((ulong)bVar35 * -2 + 1) * 4);
        puVar30 = puVar30 + (ulong)bVar35 * -2 + 1;
      }
      *(int *)(lVar24 + 0x70 + lVar34) = result_4.m_backend.exp;
      *(bool *)(lVar24 + 0x74 + lVar34) = result_4.m_backend.neg;
      *(undefined8 *)(lVar24 + 0x78 + lVar34) = result_4.m_backend._120_8_;
      iVar20 = (*(this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._vptr_SPxRatioTester[3])();
      bVar19 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)CONCAT44(extraout_var_22,iVar20),&enterId);
      if (bVar19) {
        local_440 = 0x1c00000000;
        local_4b8[0] = (cpp_dec_float<200u,int,void>)0x0;
        local_4b8[1] = (cpp_dec_float<200u,int,void>)0x0;
        local_4b8[2] = (cpp_dec_float<200u,int,void>)0x0;
        local_4b8[3] = (cpp_dec_float<200u,int,void>)0x0;
        local_4b8[4] = (cpp_dec_float<200u,int,void>)0x0;
        local_4b8[5] = (cpp_dec_float<200u,int,void>)0x0;
        local_4b8[6] = (cpp_dec_float<200u,int,void>)0x0;
        local_4b8[7] = (cpp_dec_float<200u,int,void>)0x0;
        local_4b8[8] = (cpp_dec_float<200u,int,void>)0x0;
        local_4b8[9] = (cpp_dec_float<200u,int,void>)0x0;
        local_4b8[10] = (cpp_dec_float<200u,int,void>)0x0;
        local_4b8[0xb] = (cpp_dec_float<200u,int,void>)0x0;
        local_4b8[0xc] = (cpp_dec_float<200u,int,void>)0x0;
        local_4b8[0xd] = (cpp_dec_float<200u,int,void>)0x0;
        local_4b8[0xe] = (cpp_dec_float<200u,int,void>)0x0;
        local_4b8[0xf] = (cpp_dec_float<200u,int,void>)0x0;
        local_4a8 = (undefined1  [16])0x0;
        local_498 = (undefined1  [16])0x0;
        local_488 = (undefined1  [16])0x0;
        local_478 = (undefined1  [16])0x0;
        local_468 = (undefined1  [16])0x0;
        local_458 = SUB1613((undefined1  [16])0x0,0);
        uStack_44b = 0;
        uStack_448 = 0;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=(local_4b8,0.0);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setValue((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)(lVar27 + 0x98),local_fd4,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_4b8);
        goto LAB_005be45e;
      }
      lVar24 = *(long *)(lVar27 + 0xb8);
      iVar20 = *(int *)(lVar24 + 0x70 + lVar34);
      bVar2 = *(byte *)(lVar24 + 0x74 + lVar34);
      uVar10 = *(undefined8 *)(lVar24 + 0x78 + lVar34);
      memmove(&local_f08,(void *)(lVar24 + lVar34),0x70);
      local_f08.exp = iVar20;
      local_f08.neg = (bool)bVar2;
      local_f08._120_8_ = uVar10;
      if ((fpclass_type)uVar10 == cpp_dec_float_NaN) {
LAB_005c01a6:
        pcVar28 = (cpp_dec_float<200U,_int,_void> *)(*local_e88 + lVar34);
        lVar24 = *plVar5;
        result_4.m_backend.fpclass = cpp_dec_float_finite;
        result_4.m_backend.prec_elem = 0x1c;
        result_4.m_backend.data._M_elems[0] = 0;
        result_4.m_backend.data._M_elems[1] = 0;
        result_4.m_backend.data._M_elems[2] = 0;
        result_4.m_backend.data._M_elems[3] = 0;
        result_4.m_backend.data._M_elems[4] = 0;
        result_4.m_backend.data._M_elems[5] = 0;
        result_4.m_backend.data._M_elems[6] = 0;
        result_4.m_backend.data._M_elems[7] = 0;
        result_4.m_backend.data._M_elems[8] = 0;
        result_4.m_backend.data._M_elems[9] = 0;
        result_4.m_backend.data._M_elems[10] = 0;
        result_4.m_backend.data._M_elems[0xb] = 0;
        result_4.m_backend.data._M_elems[0xc] = 0;
        result_4.m_backend.data._M_elems[0xd] = 0;
        result_4.m_backend.data._M_elems[0xe] = 0;
        result_4.m_backend.data._M_elems[0xf] = 0;
        result_4.m_backend.data._M_elems[0x10] = 0;
        result_4.m_backend.data._M_elems[0x11] = 0;
        result_4.m_backend.data._M_elems[0x12] = 0;
        result_4.m_backend.data._M_elems[0x13] = 0;
        result_4.m_backend.data._M_elems[0x14] = 0;
        result_4.m_backend.data._M_elems[0x15] = 0;
        result_4.m_backend.data._M_elems[0x16] = 0;
        result_4.m_backend.data._M_elems[0x17] = 0;
        result_4.m_backend.data._M_elems[0x18] = 0;
        result_4.m_backend.data._M_elems[0x19] = 0;
        result_4.m_backend.data._M_elems._104_5_ = 0;
        result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_4.m_backend.exp = 0;
        result_4.m_backend.neg = false;
        if (&result_4.m_backend == (cpp_dec_float<200U,_int,_void> *)(lVar24 + lVar34)) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&result_4.m_backend,pcVar28);
          if (result_4.m_backend.data._M_elems[0] != 0 ||
              result_4.m_backend.fpclass != cpp_dec_float_finite) {
            result_4.m_backend.neg = (bool)(result_4.m_backend.neg ^ 1);
          }
        }
        else {
          if (&result_4.m_backend != pcVar28) {
            pcVar31 = pcVar28;
            pcVar23 = &result_4.m_backend;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pcVar23->data)._M_elems[0] = (pcVar31->data)._M_elems[0];
              pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4);
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar35 * -8 + 4);
            }
            result_4.m_backend.exp = pcVar28->exp;
            result_4.m_backend.neg = pcVar28->neg;
            result_4.m_backend.fpclass = pcVar28->fpclass;
            result_4.m_backend.prec_elem = pcVar28->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&result_4.m_backend,(cpp_dec_float<200U,_int,_void> *)(lVar24 + lVar34));
        }
        pcVar28 = &result_4.m_backend;
        pcVar31 = &local_d58;
        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
          (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
          pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4);
        }
        local_d58.exp = result_4.m_backend.exp;
        local_d58.neg = result_4.m_backend.neg;
        local_d58.fpclass = result_4.m_backend.fpclass;
        local_d58.prec_elem = result_4.m_backend.prec_elem;
        pcVar28 = &local_f08;
        pcVar31 = &result_4.m_backend;
        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
          (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
          pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4);
        }
        result_4.m_backend.exp = local_f08.exp;
        result_4.m_backend.neg = local_f08.neg;
        result_4.m_backend.fpclass = local_f08.fpclass;
        result_4.m_backend.prec_elem = local_f08.prec_elem;
        if (result_4.m_backend.data._M_elems[0] != 0 || local_f08.fpclass != cpp_dec_float_finite) {
          result_4.m_backend.neg = (bool)(local_f08.neg ^ 1);
        }
        if (((local_f08.fpclass != cpp_dec_float_NaN) &&
            (minStability.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&result_4.m_backend,&minStability.m_backend), iVar20 < 0)) {
          pcVar28 = &local_d58;
          pnVar29 = &result_1;
          for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
            (pnVar29->m_backend).data._M_elems[0] = (pcVar28->data)._M_elems[0];
            pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar28 + ((ulong)bVar35 * -2 + 1) * 4);
            pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar29 + ((ulong)bVar35 * -2 + 1) * 4);
          }
          result_1.m_backend.exp = local_d58.exp;
          result_1.m_backend.neg = local_d58.neg;
          result_1.m_backend.fpclass = local_d58.fpclass;
          result_1.m_backend.prec_elem = local_d58.prec_elem;
          if (result_1.m_backend.data._M_elems[0] != 0 || local_d58.fpclass != cpp_dec_float_finite)
          {
            result_1.m_backend.neg = (bool)(local_d58.neg ^ 1);
          }
          if (((local_d58.fpclass != cpp_dec_float_NaN) &&
              ((this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).delta.m_backend.fpclass != cpp_dec_float_NaN)) &&
             (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&result_1.m_backend,local_df0), iVar20 < 0)) {
            result_4.m_backend.fpclass = cpp_dec_float_finite;
            result_4.m_backend.prec_elem = 0x1c;
            result_4.m_backend.data._M_elems[0] = 0;
            result_4.m_backend.data._M_elems[1] = 0;
            result_4.m_backend.data._M_elems[2] = 0;
            result_4.m_backend.data._M_elems[3] = 0;
            result_4.m_backend.data._M_elems[4] = 0;
            result_4.m_backend.data._M_elems[5] = 0;
            result_4.m_backend.data._M_elems[6] = 0;
            result_4.m_backend.data._M_elems[7] = 0;
            result_4.m_backend.data._M_elems[8] = 0;
            result_4.m_backend.data._M_elems[9] = 0;
            result_4.m_backend.data._M_elems[10] = 0;
            result_4.m_backend.data._M_elems[0xb] = 0;
            result_4.m_backend.data._M_elems[0xc] = 0;
            result_4.m_backend.data._M_elems[0xd] = 0;
            result_4.m_backend.data._M_elems[0xe] = 0;
            result_4.m_backend.data._M_elems[0xf] = 0;
            result_4.m_backend.data._M_elems[0x10] = 0;
            result_4.m_backend.data._M_elems[0x11] = 0;
            result_4.m_backend.data._M_elems[0x12] = 0;
            result_4.m_backend.data._M_elems[0x13] = 0;
            result_4.m_backend.data._M_elems[0x14] = 0;
            result_4.m_backend.data._M_elems[0x15] = 0;
            result_4.m_backend.data._M_elems[0x16] = 0;
            result_4.m_backend.data._M_elems[0x17] = 0;
            result_4.m_backend.data._M_elems[0x18] = 0;
            result_4.m_backend.data._M_elems[0x19] = 0;
            result_4.m_backend.data._M_elems._104_5_ = 0;
            result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_4.m_backend.exp = 0;
            result_4.m_backend.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&result_4.m_backend,2.0);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                      (&minStability.m_backend,&result_4.m_backend);
            iVar20 = (*(this->
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._vptr_SPxRatioTester[3])();
            lVar24 = *plVar5;
            puVar30 = (uint *)(lVar24 + lVar34);
            pnVar29 = &local_130;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pnVar29->m_backend).data._M_elems[0] = *puVar30;
              puVar30 = puVar30 + (ulong)bVar35 * -2 + 1;
              pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar29 + ((ulong)bVar35 * -2 + 1) * 4);
            }
            local_130.m_backend.exp = *(int *)(lVar24 + 0x70 + lVar34);
            local_130.m_backend.neg = *(bool *)(lVar24 + 0x74 + lVar34);
            local_130.m_backend._120_8_ = *(undefined8 *)(lVar24 + 0x78 + lVar34);
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::shiftLPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(extraout_var_23,iVar20),local_fd4,&local_130);
            goto LAB_005be45e;
          }
        }
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  (&result_4.m_backend,0,(type *)0x0);
        iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_f08,&result_4.m_backend);
        if (iVar20 < 1) goto LAB_005c01a6;
        pcVar28 = (cpp_dec_float<200U,_int,_void> *)(*local_e80 + lVar34);
        lVar24 = *plVar5;
        result_4.m_backend.fpclass = cpp_dec_float_finite;
        result_4.m_backend.prec_elem = 0x1c;
        result_4.m_backend.data._M_elems[0] = 0;
        result_4.m_backend.data._M_elems[1] = 0;
        result_4.m_backend.data._M_elems[2] = 0;
        result_4.m_backend.data._M_elems[3] = 0;
        result_4.m_backend.data._M_elems[4] = 0;
        result_4.m_backend.data._M_elems[5] = 0;
        result_4.m_backend.data._M_elems[6] = 0;
        result_4.m_backend.data._M_elems[7] = 0;
        result_4.m_backend.data._M_elems[8] = 0;
        result_4.m_backend.data._M_elems[9] = 0;
        result_4.m_backend.data._M_elems[10] = 0;
        result_4.m_backend.data._M_elems[0xb] = 0;
        result_4.m_backend.data._M_elems[0xc] = 0;
        result_4.m_backend.data._M_elems[0xd] = 0;
        result_4.m_backend.data._M_elems[0xe] = 0;
        result_4.m_backend.data._M_elems[0xf] = 0;
        result_4.m_backend.data._M_elems[0x10] = 0;
        result_4.m_backend.data._M_elems[0x11] = 0;
        result_4.m_backend.data._M_elems[0x12] = 0;
        result_4.m_backend.data._M_elems[0x13] = 0;
        result_4.m_backend.data._M_elems[0x14] = 0;
        result_4.m_backend.data._M_elems[0x15] = 0;
        result_4.m_backend.data._M_elems[0x16] = 0;
        result_4.m_backend.data._M_elems[0x17] = 0;
        result_4.m_backend.data._M_elems[0x18] = 0;
        result_4.m_backend.data._M_elems[0x19] = 0;
        result_4.m_backend.data._M_elems._104_5_ = 0;
        result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_4.m_backend.exp = 0;
        result_4.m_backend.neg = false;
        if (&result_4.m_backend == (cpp_dec_float<200U,_int,_void> *)(lVar24 + lVar34)) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&result_4.m_backend,pcVar28);
          if (result_4.m_backend.data._M_elems[0] != 0 ||
              result_4.m_backend.fpclass != cpp_dec_float_finite) {
            result_4.m_backend.neg = (bool)(result_4.m_backend.neg ^ 1);
          }
        }
        else {
          if (&result_4.m_backend != pcVar28) {
            pcVar31 = pcVar28;
            pcVar23 = &result_4.m_backend;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pcVar23->data)._M_elems[0] = (pcVar31->data)._M_elems[0];
              pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4);
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar35 * -8 + 4);
            }
            result_4.m_backend.exp = pcVar28->exp;
            result_4.m_backend.neg = pcVar28->neg;
            result_4.m_backend.fpclass = pcVar28->fpclass;
            result_4.m_backend.prec_elem = pcVar28->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&result_4.m_backend,(cpp_dec_float<200U,_int,_void> *)(lVar24 + lVar34));
        }
        pcVar28 = &result_4.m_backend;
        pcVar31 = &local_d58;
        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
          (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
          pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4);
        }
        local_d58.exp = result_4.m_backend.exp;
        local_d58.neg = result_4.m_backend.neg;
        local_d58.fpclass = result_4.m_backend.fpclass;
        local_d58.prec_elem = result_4.m_backend.prec_elem;
        if ((((local_f08.fpclass != cpp_dec_float_NaN) &&
             (minStability.m_backend.fpclass != cpp_dec_float_NaN)) &&
            ((iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_f08,&minStability.m_backend), iVar20 < 0 &&
             ((local_d58.fpclass != cpp_dec_float_NaN &&
              ((this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).delta.m_backend.fpclass != cpp_dec_float_NaN)))))) &&
           (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&local_d58,local_df0), iVar20 < 0)) {
          result_4.m_backend.fpclass = cpp_dec_float_finite;
          result_4.m_backend.prec_elem = 0x1c;
          result_4.m_backend.data._M_elems[0] = 0;
          result_4.m_backend.data._M_elems[1] = 0;
          result_4.m_backend.data._M_elems[2] = 0;
          result_4.m_backend.data._M_elems[3] = 0;
          result_4.m_backend.data._M_elems[4] = 0;
          result_4.m_backend.data._M_elems[5] = 0;
          result_4.m_backend.data._M_elems[6] = 0;
          result_4.m_backend.data._M_elems[7] = 0;
          result_4.m_backend.data._M_elems[8] = 0;
          result_4.m_backend.data._M_elems[9] = 0;
          result_4.m_backend.data._M_elems[10] = 0;
          result_4.m_backend.data._M_elems[0xb] = 0;
          result_4.m_backend.data._M_elems[0xc] = 0;
          result_4.m_backend.data._M_elems[0xd] = 0;
          result_4.m_backend.data._M_elems[0xe] = 0;
          result_4.m_backend.data._M_elems[0xf] = 0;
          result_4.m_backend.data._M_elems[0x10] = 0;
          result_4.m_backend.data._M_elems[0x11] = 0;
          result_4.m_backend.data._M_elems[0x12] = 0;
          result_4.m_backend.data._M_elems[0x13] = 0;
          result_4.m_backend.data._M_elems[0x14] = 0;
          result_4.m_backend.data._M_elems[0x15] = 0;
          result_4.m_backend.data._M_elems[0x16] = 0;
          result_4.m_backend.data._M_elems[0x17] = 0;
          result_4.m_backend.data._M_elems[0x18] = 0;
          result_4.m_backend.data._M_elems[0x19] = 0;
          result_4.m_backend.data._M_elems._104_5_ = 0;
          result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_4.m_backend.exp = 0;
          result_4.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&result_4.m_backend,2.0);
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                    (&minStability.m_backend,&result_4.m_backend);
          iVar20 = (*(this->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._vptr_SPxRatioTester[3])();
          lVar24 = *plVar5;
          puVar30 = (uint *)(lVar24 + lVar34);
          pnVar29 = &local_b0;
          for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
            (pnVar29->m_backend).data._M_elems[0] = *puVar30;
            puVar30 = puVar30 + (ulong)bVar35 * -2 + 1;
            pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar29 + ((ulong)bVar35 * -2 + 1) * 4);
          }
          local_b0.m_backend.exp = *(int *)(lVar24 + 0x70 + lVar34);
          local_b0.m_backend.neg = *(bool *)(lVar24 + 0x74 + lVar34);
          local_b0.m_backend._120_8_ = *(undefined8 *)(lVar24 + 0x78 + lVar34);
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::shiftUPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)CONCAT44(extraout_var_24,iVar20),local_fd4,&local_b0);
          goto LAB_005be45e;
        }
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                (&local_d58,&local_f08);
      if (((local_d58.fpclass == cpp_dec_float_NaN) || (local_ac8.fpclass == cpp_dec_float_NaN)) ||
         (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&local_d58,&local_ac8), iVar20 < 1)) goto LAB_005c06f3;
    } while( true );
  }
  pnVar29 = &epsilon;
  pnVar32 = &result_4;
  for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
    (pnVar32->m_backend).data._M_elems[0] = (pnVar29->m_backend).data._M_elems[0];
    pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar29 + ((ulong)bVar35 * -2 + 1) * 4);
    pnVar32 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar32 + ((ulong)bVar35 * -2 + 1) * 4);
  }
  result_4.m_backend.exp = epsilon.m_backend.exp;
  result_4.m_backend.neg = epsilon.m_backend.neg;
  result_4.m_backend.fpclass = epsilon.m_backend.fpclass;
  result_4.m_backend.prec_elem = epsilon.m_backend.prec_elem;
  if (result_4.m_backend.data._M_elems[0] != 0 || epsilon.m_backend.fpclass != cpp_dec_float_finite)
  {
    result_4.m_backend.neg = (bool)(epsilon.m_backend.neg ^ 1);
  }
  if (((epsilon.m_backend.fpclass == cpp_dec_float_NaN) ||
      ((val->m_backend).fpclass == cpp_dec_float_NaN)) ||
     (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         (&val->m_backend,&result_4.m_backend), -1 < iVar20)) {
LAB_005c06f3:
    pcVar28 = &local_d58;
    pnVar29 = val;
    for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
      (pnVar29->m_backend).data._M_elems[0] = (pcVar28->data)._M_elems[0];
      pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + ((ulong)bVar35 * -2 + 1) * 4);
      pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar29 + ((ulong)bVar35 * -2 + 1) * 4);
    }
    (val->m_backend).exp = local_d58.exp;
    (val->m_backend).neg = local_d58.neg;
    (val->m_backend).fpclass = local_d58.fpclass;
    (val->m_backend).prec_elem = local_d58.prec_elem;
    return (SPxId)enterId.super_DataKey;
  }
  local_a48 = *(double *)(in_FS_OFFSET + -8);
  local_df0 = &(this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).delta.m_backend;
LAB_005c075e:
  do {
    do {
      pnVar29 = val;
      pcVar28 = &local_ac8;
      for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
        (((cpp_dec_float<200U,_int,_void> *)&pcVar28->data)->data)._M_elems[0] =
             (pnVar29->m_backend).data._M_elems[0];
        pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar29 + ((ulong)bVar35 * -2 + 1) * 4);
        pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + ((ulong)bVar35 * -2 + 1) * 4);
      }
      local_ac8.exp = (val->m_backend).exp;
      local_ac8.neg = (val->m_backend).neg;
      local_ac8.fpclass = (val->m_backend).fpclass;
      local_ac8.prec_elem = (val->m_backend).prec_elem;
      iVar20 = (*(this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._vptr_SPxRatioTester[3])(this);
      (**(code **)(*(long *)CONCAT44(extraout_var_25,iVar20) + 0x368))
                (&result_4.m_backend,(long *)CONCAT44(extraout_var_25,iVar20));
      pcVar28 = &result_4.m_backend;
      pcVar31 = &local_9b8;
      for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
        (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
        pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
        pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4);
      }
      local_9b8.exp = result_4.m_backend.exp;
      local_9b8.neg = result_4.m_backend.neg;
      local_9b8.fpclass = result_4.m_backend.fpclass;
      local_9b8.prec_elem = result_4.m_backend.prec_elem;
      minDelta(this,&rmaxabs,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_ac8,*(int *)(lVar27 + 0xa0),*(int **)(lVar27 + 0xa8),
               *(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 **)(lVar27 + 0xb8),
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)*plVar5,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)*local_e88,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)*local_e80);
      minDelta(this,&cmaxabs,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_ac8,*(int *)(lVar7 + 0xa0),*(int **)(lVar7 + 0xa8),
               *(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 **)(lVar7 + 0xb8),
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)*plVar6,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)*plVar9,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)*plVar8);
      if (((local_ac8.fpclass != cpp_dec_float_NaN) &&
          ((val->m_backend).fpclass != cpp_dec_float_NaN)) &&
         (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&local_ac8,&val->m_backend), iVar20 == 0)) {
        return (SPxId)enterId.super_DataKey;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(&local_cd8,0);
      ::soplex::infinity::__tls_init();
      result_4.m_backend.fpclass = cpp_dec_float_finite;
      result_4.m_backend.prec_elem = 0x1c;
      result_4.m_backend.data._M_elems[0] = 0;
      result_4.m_backend.data._M_elems[1] = 0;
      result_4.m_backend.data._M_elems[2] = 0;
      result_4.m_backend.data._M_elems[3] = 0;
      result_4.m_backend.data._M_elems[4] = 0;
      result_4.m_backend.data._M_elems[5] = 0;
      result_4.m_backend.data._M_elems[6] = 0;
      result_4.m_backend.data._M_elems[7] = 0;
      result_4.m_backend.data._M_elems[8] = 0;
      result_4.m_backend.data._M_elems[9] = 0;
      result_4.m_backend.data._M_elems[10] = 0;
      result_4.m_backend.data._M_elems[0xb] = 0;
      result_4.m_backend.data._M_elems[0xc] = 0;
      result_4.m_backend.data._M_elems[0xd] = 0;
      result_4.m_backend.data._M_elems[0xe] = 0;
      result_4.m_backend.data._M_elems[0xf] = 0;
      result_4.m_backend.data._M_elems[0x10] = 0;
      result_4.m_backend.data._M_elems[0x11] = 0;
      result_4.m_backend.data._M_elems[0x12] = 0;
      result_4.m_backend.data._M_elems[0x13] = 0;
      result_4.m_backend.data._M_elems[0x14] = 0;
      result_4.m_backend.data._M_elems[0x15] = 0;
      result_4.m_backend.data._M_elems[0x16] = 0;
      result_4.m_backend.data._M_elems[0x17] = 0;
      result_4.m_backend.data._M_elems[0x18] = 0;
      result_4.m_backend.data._M_elems[0x19] = 0;
      result_4.m_backend.data._M_elems._104_5_ = 0;
      result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_4.m_backend.exp = 0;
      result_4.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&result_4.m_backend,local_a48);
      pcVar28 = &result_4.m_backend;
      pcVar31 = &local_d58;
      for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
        (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
        pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
        pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4);
      }
      local_d58.exp = result_4.m_backend.exp;
      local_d58.neg = result_4.m_backend.neg;
      local_d58.fpclass = result_4.m_backend.fpclass;
      local_d58.prec_elem = result_4.m_backend.prec_elem;
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.neg = false;
      result.m_backend.exp = 0;
      pnVar29 = &rmaxabs;
      pcVar28 = &result.m_backend;
      for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
        (pcVar28->data)._M_elems[0] = (pnVar29->m_backend).data._M_elems[0];
        pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar29 + ((ulong)bVar35 * -2 + 1) * 4);
        pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
      }
      result.m_backend.exp = rmaxabs.m_backend.exp;
      result.m_backend.neg = rmaxabs.m_backend.neg;
      result.m_backend.fpclass = rmaxabs.m_backend.fpclass;
      result.m_backend.prec_elem = rmaxabs.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&result.m_backend,&epsilon.m_backend);
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 0x1c;
      result_1.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems._16_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems._32_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems._48_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems._64_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems._80_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems[0x18] = 0;
      result_1.m_backend.data._M_elems[0x19] = 0;
      result_1.m_backend.data._M_elems._104_5_ = 0;
      result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      result_4.m_backend.fpclass = cpp_dec_float_finite;
      result_4.m_backend.prec_elem = 0x1c;
      result_4.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result_4.m_backend.data._M_elems._16_16_ = ZEXT816(0);
      result_4.m_backend.data._M_elems._32_16_ = ZEXT816(0);
      result_4.m_backend.data._M_elems._48_16_ = ZEXT816(0);
      result_4.m_backend.data._M_elems._64_16_ = ZEXT816(0);
      result_4.m_backend.data._M_elems._80_16_ = ZEXT816(0);
      result_4.m_backend.data._M_elems[0x18] = 0;
      result_4.m_backend.data._M_elems[0x19] = 0;
      result_4.m_backend.data._M_elems._104_5_ = 0;
      result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_4.m_backend.exp = 0;
      result_4.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&result_4.m_backend,0.001);
      pcVar28 = &result.m_backend;
      pcVar31 = &result_1.m_backend;
      for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
        (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
        pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
        pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4);
      }
      result_1.m_backend.exp = result.m_backend.exp;
      result_1.m_backend.neg = result.m_backend.neg;
      result_1.m_backend.fpclass = result.m_backend.fpclass;
      result_1.m_backend.prec_elem = result.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&result_1.m_backend,&result_4.m_backend);
      pcVar28 = &result_1.m_backend;
      pcVar31 = &local_bc8;
      for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
        (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
        pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
        pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4);
      }
      local_bc8.exp = result_1.m_backend.exp;
      local_bc8.neg = result_1.m_backend.neg;
      local_bc8.fpclass = result_1.m_backend.fpclass;
      local_bc8.prec_elem = result_1.m_backend.prec_elem;
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.neg = false;
      result.m_backend.exp = 0;
      pnVar29 = &cmaxabs;
      pcVar28 = &result.m_backend;
      for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
        (pcVar28->data)._M_elems[0] = (pnVar29->m_backend).data._M_elems[0];
        pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar29 + ((ulong)bVar35 * -2 + 1) * 4);
        pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
      }
      result.m_backend.exp = cmaxabs.m_backend.exp;
      result.m_backend.neg = cmaxabs.m_backend.neg;
      result.m_backend.fpclass = cmaxabs.m_backend.fpclass;
      result.m_backend.prec_elem = cmaxabs.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&result.m_backend,&epsilon.m_backend);
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 0x1c;
      result_1.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems._16_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems._32_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems._48_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems._64_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems._80_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems[0x18] = 0;
      result_1.m_backend.data._M_elems[0x19] = 0;
      result_1.m_backend.data._M_elems._104_5_ = 0;
      result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      result_4.m_backend.fpclass = cpp_dec_float_finite;
      result_4.m_backend.prec_elem = 0x1c;
      result_4.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result_4.m_backend.data._M_elems._16_16_ = ZEXT816(0);
      result_4.m_backend.data._M_elems._32_16_ = ZEXT816(0);
      result_4.m_backend.data._M_elems._48_16_ = ZEXT816(0);
      result_4.m_backend.data._M_elems._64_16_ = ZEXT816(0);
      result_4.m_backend.data._M_elems._80_16_ = ZEXT816(0);
      result_4.m_backend.data._M_elems[0x18] = 0;
      result_4.m_backend.data._M_elems[0x19] = 0;
      result_4.m_backend.data._M_elems._104_5_ = 0;
      result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_4.m_backend.exp = 0;
      result_4.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&result_4.m_backend,0.001);
      pcVar28 = &result.m_backend;
      pcVar31 = &result_1.m_backend;
      for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
        (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
        pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
        pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4);
      }
      result_1.m_backend.exp = result.m_backend.exp;
      result_1.m_backend.neg = result.m_backend.neg;
      result_1.m_backend.fpclass = result.m_backend.fpclass;
      result_1.m_backend.prec_elem = result.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&result_1.m_backend,&result_4.m_backend);
      pcVar28 = &result_1.m_backend;
      pcVar31 = &local_b48;
      for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
        (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
        pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
        pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4);
      }
      local_b48.exp = result_1.m_backend.exp;
      local_b48.neg = result_1.m_backend.neg;
      local_b48.fpclass = result_1.m_backend.fpclass;
      local_b48.prec_elem = result_1.m_backend.prec_elem;
      local_f44 = 0xffffffff;
      local_fd4 = 0xffffffff;
      if (0 < (long)*(int *)(lVar27 + 0xa0)) {
        lVar24 = (long)*(int *)(lVar27 + 0xa0) + 1;
        local_fd4 = 0xffffffff;
        do {
          lVar26 = *(long *)(lVar27 + 0xb8);
          uVar3 = *(uint *)(*(long *)(lVar27 + 0xa8) + -8 + lVar24 * 4);
          lVar34 = (long)(int)uVar3 * 0x80;
          iVar20 = *(int *)(lVar26 + 0x70 + lVar34);
          bVar2 = *(byte *)(lVar26 + 0x74 + lVar34);
          uVar10 = *(undefined8 *)(lVar26 + 0x78 + lVar34);
          memmove(&local_f08,(void *)(lVar26 + lVar34),0x70);
          local_f08.exp = iVar20;
          local_f08.neg = (bool)bVar2;
          local_f08.fpclass = (fpclass_type)uVar10;
          local_f08.prec_elem = SUB84(uVar10,4);
          if ((((fpclass_type)uVar10 == cpp_dec_float_NaN) ||
              (local_bc8.fpclass == cpp_dec_float_NaN)) ||
             (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_f08,&local_bc8), iVar20 < 1)) {
            pcVar28 = &local_bc8;
            pcVar31 = &result_4.m_backend;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
              pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4);
            }
            result_4.m_backend.exp = local_bc8.exp;
            result_4.m_backend.neg = local_bc8.neg;
            result_4.m_backend.fpclass = local_bc8.fpclass;
            result_4.m_backend.prec_elem = local_bc8.prec_elem;
            if (result_4.m_backend.data._M_elems[0] != 0 ||
                local_bc8.fpclass != cpp_dec_float_finite) {
              result_4.m_backend.neg = (bool)(local_bc8.neg ^ 1);
            }
            if (((local_bc8.fpclass == cpp_dec_float_NaN) ||
                (local_f08.fpclass == cpp_dec_float_NaN)) ||
               (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_f08,&result_4.m_backend), -1 < iVar20)) {
              lVar26 = *(long *)(lVar27 + 0xa8);
              lVar34 = *(long *)(lVar27 + 0xb8);
              lVar25 = (long)*(int *)(lVar26 + -8 + lVar24 * 4) * 0x80;
              *(undefined8 *)(lVar34 + 0x78 + lVar25) = 0x1c00000000;
              *(undefined1 (*) [16])(lVar34 + lVar25) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar34 + 0x10 + lVar25) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar34 + 0x20 + lVar25) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar34 + 0x30 + lVar25) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar34 + 0x40 + lVar25) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar34 + 0x50 + lVar25) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar34 + 0x60 + lVar25) = (undefined1  [16])0x0;
              *(undefined8 *)(lVar34 + 0x6d + lVar25) = 0;
              iVar20 = *(int *)(lVar27 + 0xa0);
              *(int *)(lVar27 + 0xa0) = iVar20 + -1;
              *(undefined4 *)(lVar26 + -8 + lVar24 * 4) =
                   *(undefined4 *)(lVar26 + -4 + (long)iVar20 * 4);
              uVar17 = result_4.m_backend._120_8_;
            }
            else {
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)(*local_e80 + lVar34);
              lVar26 = *plVar5;
              result_4.m_backend.fpclass = cpp_dec_float_finite;
              result_4.m_backend.prec_elem = 0x1c;
              result_4.m_backend.data._M_elems[0] = 0;
              result_4.m_backend.data._M_elems[1] = 0;
              result_4.m_backend.data._M_elems[2] = 0;
              result_4.m_backend.data._M_elems[3] = 0;
              result_4.m_backend.data._M_elems[4] = 0;
              result_4.m_backend.data._M_elems[5] = 0;
              result_4.m_backend.data._M_elems[6] = 0;
              result_4.m_backend.data._M_elems[7] = 0;
              result_4.m_backend.data._M_elems[8] = 0;
              result_4.m_backend.data._M_elems[9] = 0;
              result_4.m_backend.data._M_elems[10] = 0;
              result_4.m_backend.data._M_elems[0xb] = 0;
              result_4.m_backend.data._M_elems[0xc] = 0;
              result_4.m_backend.data._M_elems[0xd] = 0;
              result_4.m_backend.data._M_elems[0xe] = 0;
              result_4.m_backend.data._M_elems[0xf] = 0;
              result_4.m_backend.data._M_elems[0x10] = 0;
              result_4.m_backend.data._M_elems[0x11] = 0;
              result_4.m_backend.data._M_elems[0x12] = 0;
              result_4.m_backend.data._M_elems[0x13] = 0;
              result_4.m_backend.data._M_elems[0x14] = 0;
              result_4.m_backend.data._M_elems[0x15] = 0;
              result_4.m_backend.data._M_elems[0x16] = 0;
              result_4.m_backend.data._M_elems[0x17] = 0;
              result_4.m_backend.data._M_elems[0x18] = 0;
              result_4.m_backend.data._M_elems[0x19] = 0;
              result_4.m_backend.data._M_elems._104_5_ = 0;
              result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result_4.m_backend.exp = 0;
              result_4.m_backend.neg = false;
              if (&result_4.m_backend == (cpp_dec_float<200U,_int,_void> *)(lVar26 + lVar34)) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          (&result_4.m_backend,pcVar28);
                if (result_4.m_backend.data._M_elems[0] != 0 ||
                    result_4.m_backend.fpclass != cpp_dec_float_finite) {
                  result_4.m_backend.neg = (bool)(result_4.m_backend.neg ^ 1);
                }
              }
              else {
                if (&result_4.m_backend != pcVar28) {
                  pcVar31 = pcVar28;
                  pcVar23 = &result_4.m_backend;
                  for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                    (pcVar23->data)._M_elems[0] = (pcVar31->data)._M_elems[0];
                    pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                    pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar23 + (ulong)bVar35 * -8 + 4);
                  }
                  result_4.m_backend.exp = pcVar28->exp;
                  result_4.m_backend.neg = pcVar28->neg;
                  result_4.m_backend.fpclass = pcVar28->fpclass;
                  result_4.m_backend.prec_elem = pcVar28->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          (&result_4.m_backend,(cpp_dec_float<200U,_int,_void> *)(lVar26 + lVar34));
              }
              pcVar28 = &result_4.m_backend;
              pcVar31 = &local_e78;
              for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4)
                ;
                pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4)
                ;
              }
              local_e78.exp = result_4.m_backend.exp;
              local_e78.neg = result_4.m_backend.neg;
              local_e78.fpclass = result_4.m_backend.fpclass;
              local_e78.prec_elem = result_4.m_backend.prec_elem;
              pnVar29 = &degeneps;
              pcVar28 = &result_4.m_backend;
              for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                (pcVar28->data)._M_elems[0] = (pnVar29->m_backend).data._M_elems[0];
                pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar29 + ((ulong)bVar35 * -2 + 1) * 4);
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4)
                ;
              }
              result_4.m_backend.exp = degeneps.m_backend.exp;
              result_4.m_backend.neg = degeneps.m_backend.neg;
              uVar13._4_4_ = degeneps.m_backend.prec_elem;
              uVar13._0_4_ = degeneps.m_backend.fpclass;
              if (result_4.m_backend.data._M_elems[0] != 0 ||
                  degeneps.m_backend.fpclass != cpp_dec_float_finite) {
                result_4.m_backend.neg = (bool)(degeneps.m_backend.neg ^ 1);
              }
              fVar21 = result_4.m_backend.fpclass;
              result_4.m_backend._120_8_ = uVar13;
              if ((degeneps.m_backend.fpclass == cpp_dec_float_NaN || fVar21 == cpp_dec_float_NaN)
                 || (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              compare(&local_e78,&result_4.m_backend), -1 < iVar20)) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                          (&local_e78,&local_f08);
                uVar17 = result_4.m_backend._120_8_;
                if ((local_e78.fpclass != cpp_dec_float_NaN) &&
                   ((local_ac8.fpclass != cpp_dec_float_NaN &&
                    (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              compare(&local_e78,&local_ac8), uVar17 = result_4.m_backend._120_8_,
                    -1 < iVar20)))) {
                  pcVar28 = &local_f08;
                  pcVar31 = &result_4.m_backend;
                  for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                    (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                    pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                    pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                  }
                  result_4.m_backend.exp = local_f08.exp;
                  result_4.m_backend.neg = local_f08.neg;
                  uVar17._0_4_ = local_f08.fpclass;
                  uVar17._4_4_ = local_f08.prec_elem;
                  result_4.m_backend.fpclass = local_f08.fpclass;
                  result_4.m_backend.prec_elem = local_f08.prec_elem;
                  if (result_4.m_backend.data._M_elems[0] != 0 ||
                      local_f08.fpclass != cpp_dec_float_finite) {
                    result_4.m_backend.neg = (bool)(local_f08.neg ^ 1);
                  }
                  if (((local_f08.fpclass != cpp_dec_float_NaN) &&
                      (uVar17 = result_4.m_backend._120_8_, local_cd8.fpclass != cpp_dec_float_NaN))
                     && (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                  compare(&result_4.m_backend,&local_cd8),
                        uVar17 = result_4.m_backend._120_8_, 0 < iVar20)) {
                    iVar20 = (*(this->
                               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._vptr_SPxRatioTester[3])();
                    enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(extraout_var_28,iVar20),uVar3);
                    pcVar28 = &local_e78;
                    pcVar31 = &local_d58;
                    for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                      (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                      pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                      pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                    }
                    local_d58.exp = local_e78.exp;
                    local_d58.neg = local_e78.neg;
                    local_d58.fpclass = local_e78.fpclass;
                    local_d58.prec_elem = local_e78.prec_elem;
                    puVar30 = local_f08.data._M_elems + 1;
                    puVar33 = local_cd8.data._M_elems + 1;
                    for (lVar26 = 0x1b; lVar26 != 0; lVar26 = lVar26 + -1) {
                      *puVar33 = *puVar30;
                      puVar30 = puVar30 + (ulong)bVar35 * -2 + 1;
                      puVar33 = puVar33 + (ulong)bVar35 * -2 + 1;
                    }
                    local_cd8.data._M_elems[0] = local_f08.data._M_elems[0];
                    local_cd8.neg =
                         (bool)((local_f08.data._M_elems[0] != 0 ||
                                local_f08.fpclass != cpp_dec_float_finite) ^ local_f08.neg);
                    local_fd4 = uVar3;
                    uVar17 = result_4.m_backend._120_8_;
                    local_d58._120_8_ = local_e78._120_8_;
                    local_cd8.exp = local_f08.exp;
                    local_cd8._120_8_ = local_f08._120_8_;
                  }
                }
              }
              else {
                iVar20 = (*(this->
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           )._vptr_SPxRatioTester[3])();
                lVar26 = *plVar5;
                puVar30 = (uint *)(lVar26 + lVar34);
                pnVar29 = &local_230;
                for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                  (pnVar29->m_backend).data._M_elems[0] = *puVar30;
                  puVar30 = puVar30 + (ulong)bVar35 * -2 + 1;
                  pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar29 + ((ulong)bVar35 * -2 + 1) * 4);
                }
                local_230.m_backend.exp = *(int *)(lVar26 + 0x70 + lVar34);
                local_230.m_backend.neg = *(bool *)(lVar26 + 0x74 + lVar34);
                local_230.m_backend._120_8_ = *(undefined8 *)(lVar26 + 0x78 + lVar34);
                SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::shiftUPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(extraout_var_29,iVar20),uVar3,&local_230);
                uVar17 = result_4.m_backend._120_8_;
              }
            }
          }
          else {
            pcVar28 = (cpp_dec_float<200U,_int,_void> *)(*local_e88 + lVar34);
            lVar26 = *plVar5;
            result_4.m_backend.fpclass = cpp_dec_float_finite;
            result_4.m_backend.prec_elem = 0x1c;
            result_4.m_backend.data._M_elems[0] = 0;
            result_4.m_backend.data._M_elems[1] = 0;
            result_4.m_backend.data._M_elems[2] = 0;
            result_4.m_backend.data._M_elems[3] = 0;
            result_4.m_backend.data._M_elems[4] = 0;
            result_4.m_backend.data._M_elems[5] = 0;
            result_4.m_backend.data._M_elems[6] = 0;
            result_4.m_backend.data._M_elems[7] = 0;
            result_4.m_backend.data._M_elems[8] = 0;
            result_4.m_backend.data._M_elems[9] = 0;
            result_4.m_backend.data._M_elems[10] = 0;
            result_4.m_backend.data._M_elems[0xb] = 0;
            result_4.m_backend.data._M_elems[0xc] = 0;
            result_4.m_backend.data._M_elems[0xd] = 0;
            result_4.m_backend.data._M_elems[0xe] = 0;
            result_4.m_backend.data._M_elems[0xf] = 0;
            result_4.m_backend.data._M_elems[0x10] = 0;
            result_4.m_backend.data._M_elems[0x11] = 0;
            result_4.m_backend.data._M_elems[0x12] = 0;
            result_4.m_backend.data._M_elems[0x13] = 0;
            result_4.m_backend.data._M_elems[0x14] = 0;
            result_4.m_backend.data._M_elems[0x15] = 0;
            result_4.m_backend.data._M_elems[0x16] = 0;
            result_4.m_backend.data._M_elems[0x17] = 0;
            result_4.m_backend.data._M_elems[0x18] = 0;
            result_4.m_backend.data._M_elems[0x19] = 0;
            result_4.m_backend.data._M_elems._104_5_ = 0;
            result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_4.m_backend.exp = 0;
            result_4.m_backend.neg = false;
            if (&result_4.m_backend == (cpp_dec_float<200U,_int,_void> *)(lVar26 + lVar34)) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&result_4.m_backend,pcVar28);
              if (result_4.m_backend.data._M_elems[0] != 0 ||
                  result_4.m_backend.fpclass != cpp_dec_float_finite) {
                result_4.m_backend.neg = (bool)(result_4.m_backend.neg ^ 1);
              }
            }
            else {
              if (&result_4.m_backend != pcVar28) {
                pcVar31 = pcVar28;
                pcVar23 = &result_4.m_backend;
                for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                  (pcVar23->data)._M_elems[0] = (pcVar31->data)._M_elems[0];
                  pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                  pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar23 + (ulong)bVar35 * -8 + 4);
                }
                result_4.m_backend.exp = pcVar28->exp;
                result_4.m_backend.neg = pcVar28->neg;
                result_4.m_backend.fpclass = pcVar28->fpclass;
                result_4.m_backend.prec_elem = pcVar28->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&result_4.m_backend,(cpp_dec_float<200U,_int,_void> *)(lVar26 + lVar34));
            }
            pcVar28 = &result_4.m_backend;
            pcVar31 = &local_e78;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
              pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4);
            }
            local_e78.exp = result_4.m_backend.exp;
            local_e78.neg = result_4.m_backend.neg;
            local_e78.fpclass = result_4.m_backend.fpclass;
            local_e78.prec_elem = result_4.m_backend.prec_elem;
            if (((result_4.m_backend.fpclass == cpp_dec_float_NaN) ||
                (degeneps.m_backend.fpclass == cpp_dec_float_NaN)) ||
               (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_e78,&degeneps.m_backend), iVar20 < 1)) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                        (&local_e78,&local_f08);
              uVar17 = result_4.m_backend._120_8_;
              if (((local_e78.fpclass != cpp_dec_float_NaN) &&
                  (local_ac8.fpclass != cpp_dec_float_NaN)) &&
                 ((iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                      (&local_e78,&local_ac8), uVar17 = result_4.m_backend._120_8_,
                  -1 < iVar20 &&
                  (((local_f08.fpclass != cpp_dec_float_NaN &&
                    (local_cd8.fpclass != cpp_dec_float_NaN)) &&
                   (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                             compare(&local_f08,&local_cd8), uVar17 = result_4.m_backend._120_8_,
                   0 < iVar20)))))) {
                iVar20 = (*(this->
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           )._vptr_SPxRatioTester[3])();
                enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(extraout_var_27,iVar20),uVar3);
                pcVar28 = &local_e78;
                pcVar31 = &local_d58;
                for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                  (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                  pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                }
                local_d58.exp = local_e78.exp;
                local_d58.neg = local_e78.neg;
                local_d58.fpclass = local_e78.fpclass;
                local_d58.prec_elem = local_e78.prec_elem;
                pcVar28 = &local_f08;
                pcVar31 = &local_cd8;
                for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                  (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                  pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                }
                local_cd8.neg = local_f08.neg;
                local_fd4 = uVar3;
                uVar17 = result_4.m_backend._120_8_;
                local_d58._120_8_ = local_e78._120_8_;
                local_cd8.exp = local_f08.exp;
                local_cd8._120_8_ = local_f08._120_8_;
              }
            }
            else {
              iVar20 = (*(this->
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxRatioTester[3])();
              lVar26 = *plVar5;
              puVar30 = (uint *)(lVar26 + lVar34);
              pnVar29 = &local_1b0;
              for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                (pnVar29->m_backend).data._M_elems[0] = *puVar30;
                puVar30 = puVar30 + (ulong)bVar35 * -2 + 1;
                pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar29 + ((ulong)bVar35 * -2 + 1) * 4);
              }
              local_1b0.m_backend.exp = *(int *)(lVar26 + 0x70 + lVar34);
              local_1b0.m_backend.neg = *(bool *)(lVar26 + 0x74 + lVar34);
              local_1b0.m_backend._120_8_ = *(undefined8 *)(lVar26 + 0x78 + lVar34);
              SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::shiftLPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT44(extraout_var_26,iVar20),uVar3,&local_1b0);
              uVar17 = result_4.m_backend._120_8_;
            }
          }
          result_4.m_backend._120_8_ = uVar17;
          lVar24 = lVar24 + -1;
        } while (1 < lVar24);
      }
      if (0 < (long)*(int *)(lVar7 + 0xa0)) {
        local_f44 = 0xffffffff;
        lVar24 = (long)*(int *)(lVar7 + 0xa0);
        do {
          lVar26 = *(long *)(lVar7 + 0xb8);
          iVar20 = *(int *)(*(long *)(lVar7 + 0xa8) + -4 + lVar24 * 4);
          lVar34 = (long)iVar20 * 0x80;
          iVar22 = *(int *)(lVar26 + 0x70 + lVar34);
          bVar2 = *(byte *)(lVar26 + 0x74 + lVar34);
          uVar10 = *(undefined8 *)(lVar26 + 0x78 + lVar34);
          memmove(&local_f08,(void *)(lVar26 + lVar34),0x70);
          local_f08.exp = iVar22;
          local_f08.neg = (bool)bVar2;
          local_f08.fpclass = (fpclass_type)uVar10;
          local_f08.prec_elem = SUB84(uVar10,4);
          if ((((fpclass_type)uVar10 == cpp_dec_float_NaN) ||
              (local_b48.fpclass == cpp_dec_float_NaN)) ||
             (iVar22 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_f08,&local_b48), iVar22 < 1)) {
            pcVar28 = &local_b48;
            pcVar31 = &result_4.m_backend;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
              pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4);
            }
            result_4.m_backend.exp = local_b48.exp;
            result_4.m_backend.neg = local_b48.neg;
            result_4.m_backend.fpclass = local_b48.fpclass;
            result_4.m_backend.prec_elem = local_b48.prec_elem;
            if (result_4.m_backend.data._M_elems[0] != 0 ||
                local_b48.fpclass != cpp_dec_float_finite) {
              result_4.m_backend.neg = (bool)(local_b48.neg ^ 1);
            }
            if (((local_b48.fpclass == cpp_dec_float_NaN) ||
                (local_f08.fpclass == cpp_dec_float_NaN)) ||
               (iVar22 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_f08,&result_4.m_backend), -1 < iVar22)) {
              lVar26 = *(long *)(lVar7 + 0xa8);
              lVar34 = *(long *)(lVar7 + 0xb8);
              lVar25 = (long)*(int *)(lVar26 + -4 + lVar24 * 4) * 0x80;
              *(undefined8 *)(lVar34 + 0x78 + lVar25) = 0x1c00000000;
              *(undefined1 (*) [16])(lVar34 + lVar25) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar34 + 0x10 + lVar25) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar34 + 0x20 + lVar25) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar34 + 0x30 + lVar25) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar34 + 0x40 + lVar25) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar34 + 0x50 + lVar25) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar34 + 0x60 + lVar25) = (undefined1  [16])0x0;
              *(undefined8 *)(lVar34 + 0x6d + lVar25) = 0;
              iVar20 = *(int *)(lVar7 + 0xa0);
              *(int *)(lVar7 + 0xa0) = iVar20 + -1;
              *(undefined4 *)(lVar26 + -4 + lVar24 * 4) =
                   *(undefined4 *)(lVar26 + -4 + (long)iVar20 * 4);
              uVar16 = result_4.m_backend._120_8_;
            }
            else {
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)(*plVar8 + lVar34);
              lVar26 = *plVar6;
              result_4.m_backend.fpclass = cpp_dec_float_finite;
              result_4.m_backend.prec_elem = 0x1c;
              result_4.m_backend.data._M_elems[0] = 0;
              result_4.m_backend.data._M_elems[1] = 0;
              result_4.m_backend.data._M_elems[2] = 0;
              result_4.m_backend.data._M_elems[3] = 0;
              result_4.m_backend.data._M_elems[4] = 0;
              result_4.m_backend.data._M_elems[5] = 0;
              result_4.m_backend.data._M_elems[6] = 0;
              result_4.m_backend.data._M_elems[7] = 0;
              result_4.m_backend.data._M_elems[8] = 0;
              result_4.m_backend.data._M_elems[9] = 0;
              result_4.m_backend.data._M_elems[10] = 0;
              result_4.m_backend.data._M_elems[0xb] = 0;
              result_4.m_backend.data._M_elems[0xc] = 0;
              result_4.m_backend.data._M_elems[0xd] = 0;
              result_4.m_backend.data._M_elems[0xe] = 0;
              result_4.m_backend.data._M_elems[0xf] = 0;
              result_4.m_backend.data._M_elems[0x10] = 0;
              result_4.m_backend.data._M_elems[0x11] = 0;
              result_4.m_backend.data._M_elems[0x12] = 0;
              result_4.m_backend.data._M_elems[0x13] = 0;
              result_4.m_backend.data._M_elems[0x14] = 0;
              result_4.m_backend.data._M_elems[0x15] = 0;
              result_4.m_backend.data._M_elems[0x16] = 0;
              result_4.m_backend.data._M_elems[0x17] = 0;
              result_4.m_backend.data._M_elems[0x18] = 0;
              result_4.m_backend.data._M_elems[0x19] = 0;
              result_4.m_backend.data._M_elems._104_5_ = 0;
              result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result_4.m_backend.exp = 0;
              result_4.m_backend.neg = false;
              if (&result_4.m_backend == (cpp_dec_float<200U,_int,_void> *)(lVar26 + lVar34)) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          (&result_4.m_backend,pcVar28);
                if (result_4.m_backend.data._M_elems[0] != 0 ||
                    result_4.m_backend.fpclass != cpp_dec_float_finite) {
                  result_4.m_backend.neg = (bool)(result_4.m_backend.neg ^ 1);
                }
              }
              else {
                if (&result_4.m_backend != pcVar28) {
                  pcVar31 = pcVar28;
                  pcVar23 = &result_4.m_backend;
                  for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                    (pcVar23->data)._M_elems[0] = (pcVar31->data)._M_elems[0];
                    pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                    pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar23 + (ulong)bVar35 * -8 + 4);
                  }
                  result_4.m_backend.exp = pcVar28->exp;
                  result_4.m_backend.neg = pcVar28->neg;
                  result_4.m_backend.fpclass = pcVar28->fpclass;
                  result_4.m_backend.prec_elem = pcVar28->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          (&result_4.m_backend,(cpp_dec_float<200U,_int,_void> *)(lVar26 + lVar34));
              }
              pcVar28 = &result_4.m_backend;
              pcVar31 = &local_e78;
              for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4)
                ;
                pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4)
                ;
              }
              local_e78.exp = result_4.m_backend.exp;
              local_e78.neg = result_4.m_backend.neg;
              local_e78.fpclass = result_4.m_backend.fpclass;
              local_e78.prec_elem = result_4.m_backend.prec_elem;
              pnVar29 = &degeneps;
              pcVar28 = &result_4.m_backend;
              for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                (pcVar28->data)._M_elems[0] = (pnVar29->m_backend).data._M_elems[0];
                pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar29 + ((ulong)bVar35 * -2 + 1) * 4);
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4)
                ;
              }
              result_4.m_backend.exp = degeneps.m_backend.exp;
              result_4.m_backend.neg = degeneps.m_backend.neg;
              uVar14._4_4_ = degeneps.m_backend.prec_elem;
              uVar14._0_4_ = degeneps.m_backend.fpclass;
              if (result_4.m_backend.data._M_elems[0] != 0 ||
                  degeneps.m_backend.fpclass != cpp_dec_float_finite) {
                result_4.m_backend.neg = (bool)(degeneps.m_backend.neg ^ 1);
              }
              fVar21 = result_4.m_backend.fpclass;
              result_4.m_backend._120_8_ = uVar14;
              if ((degeneps.m_backend.fpclass == cpp_dec_float_NaN || fVar21 == cpp_dec_float_NaN)
                 || (iVar22 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              compare(&local_e78,&result_4.m_backend), -1 < iVar22)) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                          (&local_e78,&local_f08);
                uVar16 = result_4.m_backend._120_8_;
                if ((local_e78.fpclass != cpp_dec_float_NaN) &&
                   ((local_ac8.fpclass != cpp_dec_float_NaN &&
                    (iVar22 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              compare(&local_e78,&local_ac8), uVar16 = result_4.m_backend._120_8_,
                    -1 < iVar22)))) {
                  pcVar28 = &local_f08;
                  pcVar31 = &result_4.m_backend;
                  for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                    (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                    pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                    pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                  }
                  result_4.m_backend.exp = local_f08.exp;
                  result_4.m_backend.neg = local_f08.neg;
                  uVar16._0_4_ = local_f08.fpclass;
                  uVar16._4_4_ = local_f08.prec_elem;
                  result_4.m_backend.fpclass = local_f08.fpclass;
                  result_4.m_backend.prec_elem = local_f08.prec_elem;
                  if (result_4.m_backend.data._M_elems[0] != 0 ||
                      local_f08.fpclass != cpp_dec_float_finite) {
                    result_4.m_backend.neg = (bool)(local_f08.neg ^ 1);
                  }
                  if (((local_f08.fpclass != cpp_dec_float_NaN) &&
                      (uVar16 = result_4.m_backend._120_8_, local_cd8.fpclass != cpp_dec_float_NaN))
                     && (iVar22 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                                  compare(&result_4.m_backend,&local_cd8),
                        uVar16 = result_4.m_backend._120_8_, 0 < iVar22)) {
                    iVar22 = (*(this->
                               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._vptr_SPxRatioTester[3])();
                    enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT44(extraout_var_32,iVar22),iVar20);
                    pcVar28 = &local_e78;
                    pcVar31 = &local_d58;
                    for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                      (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                      pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                      pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                    }
                    local_d58.exp = local_e78.exp;
                    local_d58.neg = local_e78.neg;
                    local_d58.fpclass = local_e78.fpclass;
                    local_d58.prec_elem = local_e78.prec_elem;
                    puVar30 = local_f08.data._M_elems + 1;
                    puVar33 = local_cd8.data._M_elems + 1;
                    for (lVar26 = 0x1b; lVar26 != 0; lVar26 = lVar26 + -1) {
                      *puVar33 = *puVar30;
                      puVar30 = puVar30 + (ulong)bVar35 * -2 + 1;
                      puVar33 = puVar33 + (ulong)bVar35 * -2 + 1;
                    }
                    local_cd8.data._M_elems[0] = local_f08.data._M_elems[0];
                    local_cd8.neg =
                         (bool)((local_f08.data._M_elems[0] != 0 ||
                                local_f08.fpclass != cpp_dec_float_finite) ^ local_f08.neg);
                    goto LAB_005c1c6e;
                  }
                }
              }
              else {
                iVar22 = (*(this->
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           )._vptr_SPxRatioTester[3])();
                lVar26 = *plVar6;
                puVar30 = (uint *)(lVar26 + lVar34);
                pnVar29 = &local_330;
                for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                  (pnVar29->m_backend).data._M_elems[0] = *puVar30;
                  puVar30 = puVar30 + (ulong)bVar35 * -2 + 1;
                  pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar29 + ((ulong)bVar35 * -2 + 1) * 4);
                }
                local_330.m_backend.exp = *(int *)(lVar26 + 0x70 + lVar34);
                local_330.m_backend.neg = *(bool *)(lVar26 + 0x74 + lVar34);
                local_330.m_backend._120_8_ = *(undefined8 *)(lVar26 + 0x78 + lVar34);
                SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::shiftUCbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(extraout_var_33,iVar22),iVar20,&local_330);
                uVar16 = result_4.m_backend._120_8_;
              }
            }
          }
          else {
            pcVar28 = (cpp_dec_float<200U,_int,_void> *)(*plVar9 + lVar34);
            lVar26 = *plVar6;
            result_4.m_backend.fpclass = cpp_dec_float_finite;
            result_4.m_backend.prec_elem = 0x1c;
            result_4.m_backend.data._M_elems[0] = 0;
            result_4.m_backend.data._M_elems[1] = 0;
            result_4.m_backend.data._M_elems[2] = 0;
            result_4.m_backend.data._M_elems[3] = 0;
            result_4.m_backend.data._M_elems[4] = 0;
            result_4.m_backend.data._M_elems[5] = 0;
            result_4.m_backend.data._M_elems[6] = 0;
            result_4.m_backend.data._M_elems[7] = 0;
            result_4.m_backend.data._M_elems[8] = 0;
            result_4.m_backend.data._M_elems[9] = 0;
            result_4.m_backend.data._M_elems[10] = 0;
            result_4.m_backend.data._M_elems[0xb] = 0;
            result_4.m_backend.data._M_elems[0xc] = 0;
            result_4.m_backend.data._M_elems[0xd] = 0;
            result_4.m_backend.data._M_elems[0xe] = 0;
            result_4.m_backend.data._M_elems[0xf] = 0;
            result_4.m_backend.data._M_elems[0x10] = 0;
            result_4.m_backend.data._M_elems[0x11] = 0;
            result_4.m_backend.data._M_elems[0x12] = 0;
            result_4.m_backend.data._M_elems[0x13] = 0;
            result_4.m_backend.data._M_elems[0x14] = 0;
            result_4.m_backend.data._M_elems[0x15] = 0;
            result_4.m_backend.data._M_elems[0x16] = 0;
            result_4.m_backend.data._M_elems[0x17] = 0;
            result_4.m_backend.data._M_elems[0x18] = 0;
            result_4.m_backend.data._M_elems[0x19] = 0;
            result_4.m_backend.data._M_elems._104_5_ = 0;
            result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_4.m_backend.exp = 0;
            result_4.m_backend.neg = false;
            if (&result_4.m_backend == (cpp_dec_float<200U,_int,_void> *)(lVar26 + lVar34)) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&result_4.m_backend,pcVar28);
              if (result_4.m_backend.data._M_elems[0] != 0 ||
                  result_4.m_backend.fpclass != cpp_dec_float_finite) {
                result_4.m_backend.neg = (bool)(result_4.m_backend.neg ^ 1);
              }
            }
            else {
              if (&result_4.m_backend != pcVar28) {
                pcVar31 = pcVar28;
                pcVar23 = &result_4.m_backend;
                for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                  (pcVar23->data)._M_elems[0] = (pcVar31->data)._M_elems[0];
                  pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                  pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar23 + (ulong)bVar35 * -8 + 4);
                }
                result_4.m_backend.exp = pcVar28->exp;
                result_4.m_backend.neg = pcVar28->neg;
                result_4.m_backend.fpclass = pcVar28->fpclass;
                result_4.m_backend.prec_elem = pcVar28->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&result_4.m_backend,(cpp_dec_float<200U,_int,_void> *)(lVar26 + lVar34));
            }
            pcVar28 = &result_4.m_backend;
            pcVar31 = &local_e78;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
              pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4);
            }
            local_e78.exp = result_4.m_backend.exp;
            local_e78.neg = result_4.m_backend.neg;
            local_e78.fpclass = result_4.m_backend.fpclass;
            local_e78.prec_elem = result_4.m_backend.prec_elem;
            if (((result_4.m_backend.fpclass == cpp_dec_float_NaN) ||
                (degeneps.m_backend.fpclass == cpp_dec_float_NaN)) ||
               (iVar22 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_e78,&degeneps.m_backend), iVar22 < 1)) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                        (&local_e78,&local_f08);
              uVar16 = result_4.m_backend._120_8_;
              if (((local_e78.fpclass != cpp_dec_float_NaN) &&
                  (local_ac8.fpclass != cpp_dec_float_NaN)) &&
                 ((iVar22 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                      (&local_e78,&local_ac8), uVar16 = result_4.m_backend._120_8_,
                  -1 < iVar22 &&
                  (((local_f08.fpclass != cpp_dec_float_NaN &&
                    (local_cd8.fpclass != cpp_dec_float_NaN)) &&
                   (iVar22 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                             compare(&local_f08,&local_cd8), uVar16 = result_4.m_backend._120_8_,
                   0 < iVar22)))))) {
                iVar22 = (*(this->
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           )._vptr_SPxRatioTester[3])();
                enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT44(extraout_var_31,iVar22),iVar20);
                pcVar28 = &local_e78;
                pcVar31 = &local_d58;
                for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                  (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                  pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                }
                local_d58.exp = local_e78.exp;
                local_d58.neg = local_e78.neg;
                local_d58.fpclass = local_e78.fpclass;
                local_d58.prec_elem = local_e78.prec_elem;
                pcVar28 = &local_f08;
                pcVar31 = &local_cd8;
                for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
                  (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + (ulong)bVar35 * -8 + 4);
                  pcVar31 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar31 + (ulong)bVar35 * -8 + 4);
                }
                local_cd8.neg = local_f08.neg;
LAB_005c1c6e:
                local_f44 = (uint)(lVar24 + -1);
                uVar16 = result_4.m_backend._120_8_;
                local_d58.exp = local_e78.exp;
                local_d58.neg = local_e78.neg;
                local_d58._120_8_ = local_e78._120_8_;
                local_cd8.exp = local_f08.exp;
                local_cd8._120_8_ = local_f08._120_8_;
              }
            }
            else {
              iVar22 = (*(this->
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxRatioTester[3])();
              lVar26 = *plVar6;
              puVar30 = (uint *)(lVar26 + lVar34);
              pnVar29 = &local_2b0;
              for (lVar25 = 0x1c; lVar25 != 0; lVar25 = lVar25 + -1) {
                (pnVar29->m_backend).data._M_elems[0] = *puVar30;
                puVar30 = puVar30 + (ulong)bVar35 * -2 + 1;
                pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar29 + ((ulong)bVar35 * -2 + 1) * 4);
              }
              local_2b0.m_backend.exp = *(int *)(lVar26 + 0x70 + lVar34);
              local_2b0.m_backend.neg = *(bool *)(lVar26 + 0x74 + lVar34);
              local_2b0.m_backend._120_8_ = *(undefined8 *)(lVar26 + 0x78 + lVar34);
              SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::shiftLCbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT44(extraout_var_30,iVar22),iVar20,&local_2b0);
              uVar16 = result_4.m_backend._120_8_;
            }
          }
          result_4.m_backend._120_8_ = uVar16;
          bVar19 = 1 < lVar24;
          lVar24 = lVar24 + -1;
        } while (bVar19);
      }
      iVar20 = (*(this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._vptr_SPxRatioTester[3])();
      (**(code **)(*(long *)CONCAT44(extraout_var_34,iVar20) + 0x368))
                (&result_4.m_backend,(long *)CONCAT44(extraout_var_34,iVar20));
    } while (((local_9b8.fpclass == cpp_dec_float_NaN) ||
             (result_4.m_backend.fpclass == cpp_dec_float_NaN)) ||
            (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (&local_9b8,&result_4.m_backend), iVar20 != 0));
    if (-1 < (int)local_f44) {
      iVar20 = (*(this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._vptr_SPxRatioTester[3])();
      bVar19 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)CONCAT44(extraout_var_35,iVar20),&enterId);
      if (!bVar19) goto LAB_005c06f3;
      lVar24 = *(long *)(lVar7 + 0xa8);
      lVar26 = *(long *)(lVar7 + 0xb8);
      lVar34 = (long)*(int *)(lVar24 + (ulong)local_f44 * 4) * 0x80;
      *(undefined8 *)(lVar26 + 0x78 + lVar34) = 0x1c00000000;
      *(undefined1 (*) [16])(lVar26 + lVar34) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(lVar26 + 0x10 + lVar34) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(lVar26 + 0x20 + lVar34) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(lVar26 + 0x30 + lVar34) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(lVar26 + 0x40 + lVar34) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(lVar26 + 0x50 + lVar34) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(lVar26 + 0x60 + lVar34) = (undefined1  [16])0x0;
      *(undefined8 *)(lVar26 + 0x6d + lVar34) = 0;
      iVar20 = *(int *)(lVar7 + 0xa0);
      *(int *)(lVar7 + 0xa0) = iVar20 + -1;
      *(undefined4 *)(lVar24 + (ulong)local_f44 * 4) =
           *(undefined4 *)(lVar24 + -4 + (long)iVar20 * 4);
      goto LAB_005c075e;
    }
    if ((int)local_fd4 < 0) {
LAB_005c25ea:
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(&val->m_backend,0);
      enterId.super_DataKey = enterId.super_DataKey & 0xffffffff00000000;
      return (SPxId)enterId.super_DataKey;
    }
    iVar20 = (*(this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxRatioTester[3])();
    lVar24 = *(long *)(CONCAT44(extraout_var_36,iVar20) + 0xc58);
    lVar26 = *(long *)(lVar24 + 0x20);
    lVar24 = (long)*(int *)(*(long *)(lVar24 + 0x28) + 4 + (ulong)local_fd4 * 8);
    result_4.m_backend.fpclass = cpp_dec_float_finite;
    result_4.m_backend.prec_elem = 0x1c;
    result_4.m_backend.data._M_elems[0] = 0;
    result_4.m_backend.data._M_elems[1] = 0;
    result_4.m_backend.data._M_elems[2] = 0;
    result_4.m_backend.data._M_elems[3] = 0;
    result_4.m_backend.data._M_elems[4] = 0;
    result_4.m_backend.data._M_elems[5] = 0;
    result_4.m_backend.data._M_elems[6] = 0;
    result_4.m_backend.data._M_elems[7] = 0;
    result_4.m_backend.data._M_elems[8] = 0;
    result_4.m_backend.data._M_elems[9] = 0;
    result_4.m_backend.data._M_elems[10] = 0;
    result_4.m_backend.data._M_elems[0xb] = 0;
    result_4.m_backend.data._M_elems[0xc] = 0;
    result_4.m_backend.data._M_elems[0xd] = 0;
    result_4.m_backend.data._M_elems[0xe] = 0;
    result_4.m_backend.data._M_elems[0xf] = 0;
    result_4.m_backend.data._M_elems[0x10] = 0;
    result_4.m_backend.data._M_elems[0x11] = 0;
    result_4.m_backend.data._M_elems[0x12] = 0;
    result_4.m_backend.data._M_elems[0x13] = 0;
    result_4.m_backend.data._M_elems[0x14] = 0;
    result_4.m_backend.data._M_elems[0x15] = 0;
    result_4.m_backend.data._M_elems[0x16] = 0;
    result_4.m_backend.data._M_elems[0x17] = 0;
    result_4.m_backend.data._M_elems[0x18] = 0;
    result_4.m_backend.data._M_elems[0x19] = 0;
    result_4.m_backend.data._M_elems._104_5_ = 0;
    result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_4.m_backend.exp = 0;
    result_4.m_backend.neg = false;
    iVar20 = *(int *)(lVar26 + 0xc + lVar24 * 0x28);
    if (0 < iVar20) {
      pcVar28 = *(cpp_dec_float<200U,_int,_void> **)(lVar26 + lVar24 * 0x28);
      iVar20 = iVar20 + 1;
      do {
        pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)(int)(((cpp_dec_float<200U,_int,_void> *)&pcVar28[1].data)->data)._M_elems
                              [0] * 0x80 + *plVar6);
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x1c;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems[0xe] = 0;
        result_1.m_backend.data._M_elems[0xf] = 0;
        result_1.m_backend.data._M_elems[0x10] = 0;
        result_1.m_backend.data._M_elems[0x11] = 0;
        result_1.m_backend.data._M_elems[0x12] = 0;
        result_1.m_backend.data._M_elems[0x13] = 0;
        result_1.m_backend.data._M_elems[0x14] = 0;
        result_1.m_backend.data._M_elems[0x15] = 0;
        result_1.m_backend.data._M_elems[0x16] = 0;
        result_1.m_backend.data._M_elems[0x17] = 0;
        result_1.m_backend.data._M_elems[0x18] = 0;
        result_1.m_backend.data._M_elems[0x19] = 0;
        result_1.m_backend.data._M_elems._104_5_ = 0;
        result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        pcVar31 = pcVar28;
        if ((&result_1.m_backend != pcVar23) && (pcVar31 = pcVar23, pcVar28 != &result_1.m_backend))
        {
          pcVar23 = pcVar28;
          pnVar29 = &result_1;
          for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
            (pnVar29->m_backend).data._M_elems[0] =
                 (((cpp_dec_float<200U,_int,_void> *)&pcVar23->data)->data)._M_elems[0];
            pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar35 * -8 + 4);
            pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar29 + ((ulong)bVar35 * -2 + 1) * 4);
          }
          result_1.m_backend.exp = pcVar28->exp;
          result_1.m_backend.neg = pcVar28->neg;
          result_1.m_backend.fpclass = pcVar28->fpclass;
          result_1.m_backend.prec_elem = pcVar28->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&result_1.m_backend,pcVar31);
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                  (&result_4.m_backend,&result_1.m_backend);
        pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                  ((((cpp_dec_float<200U,_int,_void> *)&pcVar28[1].data)->data)._M_elems + 1);
        iVar20 = iVar20 + -1;
      } while (1 < iVar20);
    }
    pcVar28 = &result_4.m_backend;
    pnVar29 = &result_1;
    for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
      (pnVar29->m_backend).data._M_elems[0] = (pcVar28->data)._M_elems[0];
      pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
      pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar29 + ((ulong)bVar35 * -2 + 1) * 4);
    }
    lVar24 = *plVar5;
    lVar34 = (ulong)local_fd4 * 0x80;
    pnVar29 = &result_1;
    puVar30 = (uint *)(lVar24 + lVar34);
    for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
      *puVar30 = (pnVar29->m_backend).data._M_elems[0];
      pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar29 + ((ulong)bVar35 * -2 + 1) * 4);
      puVar30 = puVar30 + (ulong)bVar35 * -2 + 1;
    }
    *(int *)(lVar24 + 0x70 + lVar34) = result_4.m_backend.exp;
    *(bool *)(lVar24 + 0x74 + lVar34) = result_4.m_backend.neg;
    *(undefined8 *)(lVar24 + 0x78 + lVar34) = result_4.m_backend._120_8_;
    iVar20 = (*(this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxRatioTester[3])();
    bVar19 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(extraout_var_37,iVar20),&enterId);
    if (bVar19) {
      local_4c0 = 0x1c00000000;
      local_538[0] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[1] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[2] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[3] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[4] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[5] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[6] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[7] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[8] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[9] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[10] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[0xb] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[0xc] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[0xd] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[0xe] = (cpp_dec_float<200u,int,void>)0x0;
      local_538[0xf] = (cpp_dec_float<200u,int,void>)0x0;
      local_528 = (undefined1  [16])0x0;
      local_518 = (undefined1  [16])0x0;
      local_508 = (undefined1  [16])0x0;
      local_4f8 = (undefined1  [16])0x0;
      local_4e8 = (undefined1  [16])0x0;
      local_4d8 = SUB1613((undefined1  [16])0x0,0);
      uStack_4cb = 0;
      uStack_4c8 = 0;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=(local_538,0.0);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setValue((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)(lVar27 + 0x98),local_fd4,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_538);
      goto LAB_005c075e;
    }
    lVar24 = *(long *)(lVar27 + 0xb8);
    iVar20 = *(int *)(lVar24 + 0x70 + lVar34);
    bVar2 = *(byte *)(lVar24 + 0x74 + lVar34);
    uVar10 = *(undefined8 *)(lVar24 + 0x78 + lVar34);
    memmove(&local_f08,(void *)(lVar24 + lVar34),0x70);
    local_f08.exp = iVar20;
    local_f08.neg = (bool)bVar2;
    local_f08._120_8_ = uVar10;
    if ((fpclass_type)uVar10 == cpp_dec_float_NaN) {
LAB_005c21b7:
      pcVar28 = (cpp_dec_float<200U,_int,_void> *)(*local_e80 + lVar34);
      lVar24 = *plVar5;
      result_4.m_backend.fpclass = cpp_dec_float_finite;
      result_4.m_backend.prec_elem = 0x1c;
      result_4.m_backend.data._M_elems[0] = 0;
      result_4.m_backend.data._M_elems[1] = 0;
      result_4.m_backend.data._M_elems[2] = 0;
      result_4.m_backend.data._M_elems[3] = 0;
      result_4.m_backend.data._M_elems[4] = 0;
      result_4.m_backend.data._M_elems[5] = 0;
      result_4.m_backend.data._M_elems[6] = 0;
      result_4.m_backend.data._M_elems[7] = 0;
      result_4.m_backend.data._M_elems[8] = 0;
      result_4.m_backend.data._M_elems[9] = 0;
      result_4.m_backend.data._M_elems[10] = 0;
      result_4.m_backend.data._M_elems[0xb] = 0;
      result_4.m_backend.data._M_elems[0xc] = 0;
      result_4.m_backend.data._M_elems[0xd] = 0;
      result_4.m_backend.data._M_elems[0xe] = 0;
      result_4.m_backend.data._M_elems[0xf] = 0;
      result_4.m_backend.data._M_elems[0x10] = 0;
      result_4.m_backend.data._M_elems[0x11] = 0;
      result_4.m_backend.data._M_elems[0x12] = 0;
      result_4.m_backend.data._M_elems[0x13] = 0;
      result_4.m_backend.data._M_elems[0x14] = 0;
      result_4.m_backend.data._M_elems[0x15] = 0;
      result_4.m_backend.data._M_elems[0x16] = 0;
      result_4.m_backend.data._M_elems[0x17] = 0;
      result_4.m_backend.data._M_elems[0x18] = 0;
      result_4.m_backend.data._M_elems[0x19] = 0;
      result_4.m_backend.data._M_elems._104_5_ = 0;
      result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_4.m_backend.exp = 0;
      result_4.m_backend.neg = false;
      if (&result_4.m_backend == (cpp_dec_float<200U,_int,_void> *)(lVar24 + lVar34)) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&result_4.m_backend,pcVar28);
        if (result_4.m_backend.data._M_elems[0] != 0 ||
            result_4.m_backend.fpclass != cpp_dec_float_finite) {
          result_4.m_backend.neg = (bool)(result_4.m_backend.neg ^ 1);
        }
      }
      else {
        if (&result_4.m_backend != pcVar28) {
          pcVar31 = pcVar28;
          pcVar23 = &result_4.m_backend;
          for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
            (pcVar23->data)._M_elems[0] = (pcVar31->data)._M_elems[0];
            pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4);
            pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar35 * -8 + 4);
          }
          result_4.m_backend.exp = pcVar28->exp;
          result_4.m_backend.neg = pcVar28->neg;
          result_4.m_backend.fpclass = pcVar28->fpclass;
          result_4.m_backend.prec_elem = pcVar28->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&result_4.m_backend,(cpp_dec_float<200U,_int,_void> *)(lVar24 + lVar34));
      }
      pcVar28 = &result_4.m_backend;
      pcVar31 = &local_d58;
      for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
        (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
        pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
        pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4);
      }
      local_d58.exp = result_4.m_backend.exp;
      local_d58.neg = result_4.m_backend.neg;
      local_d58.fpclass = result_4.m_backend.fpclass;
      local_d58.prec_elem = result_4.m_backend.prec_elem;
      pcVar28 = &local_f08;
      pcVar31 = &result_4.m_backend;
      for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
        (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
        pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
        pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4);
      }
      result_4.m_backend.exp = local_f08.exp;
      result_4.m_backend.neg = local_f08.neg;
      result_4.m_backend.fpclass = local_f08.fpclass;
      result_4.m_backend.prec_elem = local_f08.prec_elem;
      if (result_4.m_backend.data._M_elems[0] != 0 || local_f08.fpclass != cpp_dec_float_finite) {
        result_4.m_backend.neg = (bool)(local_f08.neg ^ 1);
      }
      uVar15 = result_4.m_backend._120_8_;
      if (((((local_f08.fpclass != cpp_dec_float_NaN) &&
            (minStability.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&result_4.m_backend,&minStability.m_backend),
           uVar15 = result_4.m_backend._120_8_, iVar20 < 0)) &&
          ((local_d58.fpclass != cpp_dec_float_NaN &&
           ((this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).delta.m_backend.fpclass != cpp_dec_float_NaN)))) &&
         (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&local_d58,local_df0), uVar15 = result_4.m_backend._120_8_, iVar20 < 0
         )) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::div_unsigned_long_long
                  (&minStability.m_backend,2);
        iVar20 = (*(this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._vptr_SPxRatioTester[3])();
        lVar24 = *plVar5;
        puVar30 = (uint *)(lVar24 + lVar34);
        pnVar29 = &local_430;
        for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
          (pnVar29->m_backend).data._M_elems[0] = *puVar30;
          puVar30 = puVar30 + (ulong)bVar35 * -2 + 1;
          pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar29 + ((ulong)bVar35 * -2 + 1) * 4);
        }
        local_430.m_backend.exp = *(int *)(lVar24 + 0x70 + lVar34);
        local_430.m_backend.neg = *(bool *)(lVar24 + 0x74 + lVar34);
        local_430.m_backend._120_8_ = *(undefined8 *)(lVar24 + 0x78 + lVar34);
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::shiftUPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(extraout_var_38,iVar20),local_fd4,&local_430);
        goto LAB_005c075e;
      }
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&result_4.m_backend,0,(type *)0x0);
      iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         (&local_f08,&result_4.m_backend);
      if (iVar20 < 1) goto LAB_005c21b7;
      pcVar28 = (cpp_dec_float<200U,_int,_void> *)(*local_e88 + lVar34);
      lVar24 = *plVar5;
      result_4.m_backend.fpclass = cpp_dec_float_finite;
      result_4.m_backend.prec_elem = 0x1c;
      result_4.m_backend.data._M_elems[0] = 0;
      result_4.m_backend.data._M_elems[1] = 0;
      result_4.m_backend.data._M_elems[2] = 0;
      result_4.m_backend.data._M_elems[3] = 0;
      result_4.m_backend.data._M_elems[4] = 0;
      result_4.m_backend.data._M_elems[5] = 0;
      result_4.m_backend.data._M_elems[6] = 0;
      result_4.m_backend.data._M_elems[7] = 0;
      result_4.m_backend.data._M_elems[8] = 0;
      result_4.m_backend.data._M_elems[9] = 0;
      result_4.m_backend.data._M_elems[10] = 0;
      result_4.m_backend.data._M_elems[0xb] = 0;
      result_4.m_backend.data._M_elems[0xc] = 0;
      result_4.m_backend.data._M_elems[0xd] = 0;
      result_4.m_backend.data._M_elems[0xe] = 0;
      result_4.m_backend.data._M_elems[0xf] = 0;
      result_4.m_backend.data._M_elems[0x10] = 0;
      result_4.m_backend.data._M_elems[0x11] = 0;
      result_4.m_backend.data._M_elems[0x12] = 0;
      result_4.m_backend.data._M_elems[0x13] = 0;
      result_4.m_backend.data._M_elems[0x14] = 0;
      result_4.m_backend.data._M_elems[0x15] = 0;
      result_4.m_backend.data._M_elems[0x16] = 0;
      result_4.m_backend.data._M_elems[0x17] = 0;
      result_4.m_backend.data._M_elems[0x18] = 0;
      result_4.m_backend.data._M_elems[0x19] = 0;
      result_4.m_backend.data._M_elems._104_5_ = 0;
      result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_4.m_backend.exp = 0;
      result_4.m_backend.neg = false;
      if (&result_4.m_backend == (cpp_dec_float<200U,_int,_void> *)(lVar24 + lVar34)) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&result_4.m_backend,pcVar28);
        if (result_4.m_backend.data._M_elems[0] != 0 ||
            result_4.m_backend.fpclass != cpp_dec_float_finite) {
          result_4.m_backend.neg = (bool)(result_4.m_backend.neg ^ 1);
        }
      }
      else {
        if (&result_4.m_backend != pcVar28) {
          pcVar31 = pcVar28;
          pcVar23 = &result_4.m_backend;
          for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
            (pcVar23->data)._M_elems[0] = (pcVar31->data)._M_elems[0];
            pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4);
            pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar35 * -8 + 4);
          }
          result_4.m_backend.exp = pcVar28->exp;
          result_4.m_backend.neg = pcVar28->neg;
          result_4.m_backend.fpclass = pcVar28->fpclass;
          result_4.m_backend.prec_elem = pcVar28->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&result_4.m_backend,(cpp_dec_float<200U,_int,_void> *)(lVar24 + lVar34));
      }
      pcVar28 = &result_4.m_backend;
      pcVar31 = &local_d58;
      for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
        (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
        pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
        pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4);
      }
      local_d58.exp = result_4.m_backend.exp;
      local_d58.neg = result_4.m_backend.neg;
      local_d58.fpclass = result_4.m_backend.fpclass;
      local_d58.prec_elem = result_4.m_backend.prec_elem;
      uVar15 = result_4.m_backend._120_8_;
      if (((local_f08.fpclass != cpp_dec_float_NaN) &&
          (minStability.m_backend.fpclass != cpp_dec_float_NaN)) &&
         (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&local_f08,&minStability.m_backend),
         uVar15 = result_4.m_backend._120_8_, iVar20 < 0)) {
        pcVar28 = &local_d58;
        pcVar31 = &result_4.m_backend;
        for (lVar24 = 0x1c; lVar24 != 0; lVar24 = lVar24 + -1) {
          (pcVar31->data)._M_elems[0] = (pcVar28->data)._M_elems[0];
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar35 * -8 + 4);
          pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar35 * -8 + 4);
        }
        result_4.m_backend.exp = local_d58.exp;
        result_4.m_backend.neg = local_d58.neg;
        uVar15._0_4_ = local_d58.fpclass;
        uVar15._4_4_ = local_d58.prec_elem;
        result_4.m_backend.fpclass = local_d58.fpclass;
        result_4.m_backend.prec_elem = local_d58.prec_elem;
        if (result_4.m_backend.data._M_elems[0] != 0 || local_d58.fpclass != cpp_dec_float_finite) {
          result_4.m_backend.neg = (bool)(local_d58.neg ^ 1);
        }
        if (((local_d58.fpclass != cpp_dec_float_NaN) &&
            (uVar15 = result_4.m_backend._120_8_,
            (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).delta.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&result_4.m_backend,local_df0), uVar15 = result_4.m_backend._120_8_,
           iVar20 < 0)) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::div_unsigned_long_long
                    (&minStability.m_backend,2);
          iVar20 = (*(this->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._vptr_SPxRatioTester[3])();
          lVar24 = *plVar5;
          puVar30 = (uint *)(lVar24 + lVar34);
          pnVar29 = &local_3b0;
          for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
            (pnVar29->m_backend).data._M_elems[0] = *puVar30;
            puVar30 = puVar30 + (ulong)bVar35 * -2 + 1;
            pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar29 + ((ulong)bVar35 * -2 + 1) * 4);
          }
          local_3b0.m_backend.exp = *(int *)(lVar24 + 0x70 + lVar34);
          local_3b0.m_backend.neg = *(bool *)(lVar24 + 0x74 + lVar34);
          local_3b0.m_backend._120_8_ = *(undefined8 *)(lVar24 + 0x78 + lVar34);
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::shiftLPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)CONCAT44(extraout_var_39,iVar20),local_fd4,&local_3b0);
          goto LAB_005c075e;
        }
      }
    }
    result_4.m_backend._120_8_ = uVar15;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
              (&local_d58,&local_f08);
    if (((local_d58.fpclass == cpp_dec_float_NaN) || (local_ac8.fpclass == cpp_dec_float_NaN)) ||
       (iVar20 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_d58,&local_ac8), -1 < iVar20)) goto LAB_005c06f3;
  } while( true );
}

Assistant:

SPxId SPxHarrisRT<R>::selectEnter(R& val, int, bool)
{
   int i, j;
   SPxId enterId;
   R stab, x, y;
   R max = 0.0;
   R sel = 0.0;
   R lastshift;
   R cuseeps;
   R ruseeps;
   R cmaxabs = 1;
   R rmaxabs = 1;
   int pnr, cnr;

   R minStability = this->tolerances()->scaleAccordingToEpsilon(1e-4);
   R epsilon      = this->solver()->epsilon();
   R degeneps     = degenerateEps();

   VectorBase<R>& pvec = this->solver()->pVec();
   SSVectorBase<R>& pupd = this->solver()->pVec().delta();

   VectorBase<R>& cvec = this->solver()->coPvec();
   SSVectorBase<R>& cupd = this->solver()->coPvec().delta();

   const VectorBase<R>& upb = this->solver()->upBound();
   const VectorBase<R>& lpb = this->solver()->lpBound();
   const VectorBase<R>& ucb = this->solver()->ucBound();
   const VectorBase<R>& lcb = this->solver()->lcBound();

   assert(this->delta > epsilon);
   assert(epsilon > 0);
   assert(this->solver()->maxCycle() > 0);

   this->solver()->coPvec().delta().setup();
   this->solver()->pVec().delta().setup();

   if(val > epsilon)
   {
      for(;;)
      {
         pnr = -1;
         cnr = -1;
         max = val;
         lastshift = this->solver()->shift();
         assert(this->delta > epsilon);

         // phase 1:
         maxDelta(
            &rmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            pupd.size(),         /* # of indices in pupd */
            pupd.indexMem(),     /* nonzero indices in pupd */
            pupd.values(),       /* update VectorBase<R> for vec */
            pvec.get_const_ptr(),                /* current VectorBase<R> */
            lpb.get_const_ptr(),                 /* lower bounds for vec */
            upb.get_const_ptr()                  /* upper bounds for vec */
         );

         maxDelta(
            &cmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            cupd.size(),         /* # of indices in cupd */
            cupd.indexMem(),     /* nonzero indices in cupd */
            cupd.values(),       /* update VectorBase<R> for vec */
            cvec.get_const_ptr(),                /* current VectorBase<R> */
            lcb.get_const_ptr(),                 /* lower bounds for vec */
            ucb.get_const_ptr()                  /* upper bounds for vec */
         );

         if(max == val)
            return enterId;


         // phase 2:
         stab = 0;
         sel = R(-infinity);
         ruseeps = rmaxabs * 0.001 * epsilon;

         if(ruseeps < epsilon)
            ruseeps = epsilon;

         cuseeps = cmaxabs * 0.001 * epsilon;

         if(cuseeps < epsilon)
            cuseeps = epsilon;

         for(j = pupd.size() - 1; j >= 0; --j)
         {
            i = pupd.index(j);
            x = pupd[i];

            if(x > ruseeps)
            {
               y = upb[i] - pvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUPbound(i, pvec[i] - degeneps);
               else
               {
                  y /= x;

                  if(y <= max && x >= stab)        // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = x;
                  }
               }
            }
            else if(x < -ruseeps)
            {
               y = lpb[i] - pvec[i];

               if(y > degeneps)
                  this->solver()->shiftLPbound(i, pvec[i] + degeneps);
               else
               {
                  y /= x;

                  if(y <= max && -x >= stab)       // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI01 removing value {}\n", pupd[i]);
               pupd.clearNum(j);
            }
         }

         for(j = cupd.size() - 1; j >= 0; --j)
         {
            i = cupd.index(j);
            x = cupd[i];

            if(x > cuseeps)
            {
               y = ucb[i] - cvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUCbound(i, cvec[i] - degeneps);
               else
               {
                  y /= x;

                  if(y <= max && x >= stab)        // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = x;
                  }
               }
            }
            else if(x < -cuseeps)
            {
               y = lcb[i] - cvec[i];

               if(y > degeneps)
                  this->solver()->shiftLCbound(i, cvec[i] + degeneps);
               else
               {
                  y /= x;

                  if(y <= max && -x >= stab)       // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI02 removing value {}\n", cupd[i]);
               cupd.clearNum(j);
            }
         }

         if(lastshift == this->solver()->shift())
         {
            if(cnr >= 0)
            {
               if(this->solver()->isBasic(enterId))
               {
                  cupd.clearNum(cnr);
                  continue;
               }
               else
                  break;
            }
            else if(pnr >= 0)
            {
               pvec[pnr] = this->solver()->vector(pnr) * cvec;

               if(this->solver()->isBasic(enterId))
               {
                  pupd.setValue(pnr, 0.0);
                  continue;
               }
               else
               {
                  x = pupd[pnr];

                  if(x > 0)
                  {
                     sel = upb[pnr] - pvec[pnr];

                     if(x < minStability && sel < this->delta)
                     {
                        minStability /= 2.0;
                        this->solver()->shiftUPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }
                  else
                  {
                     sel = lpb[pnr] - pvec[pnr];

                     if(-x < minStability && -sel < this->delta)
                     {
                        minStability /= 2.0;
                        this->solver()->shiftLPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }

                  sel /= x;
               }
            }
            else
            {
               val = 0;
               enterId.inValidate();
               return enterId;
            }

            if(sel > max)              // instability detected => recompute
               continue;               // ratio test with corrected value

            break;
         }
      }
   }
   else if(val < -epsilon)
   {
      for(;;)
      {
         pnr = -1;
         cnr = -1;
         max = val;
         lastshift = this->solver()->shift();
         assert(this->delta > epsilon);


         // phase 1:
         minDelta
         (
            &rmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            pupd.size(),         /* # of indices in pupd */
            pupd.indexMem(),     /* nonzero indices in pupd */
            pupd.values(),       /* update VectorBase<R> for vec */
            pvec.get_const_ptr(),                /* current VectorBase<R> */
            lpb.get_const_ptr(),                 /* lower bounds for vec */
            upb.get_const_ptr()                  /* upper bounds for vec */
         );

         minDelta
         (
            &cmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            cupd.size(),         /* # of indices in cupd */
            cupd.indexMem(),     /* nonzero indices in cupd */
            cupd.values(),       /* update VectorBase<R> for vec */
            cvec.get_const_ptr(),                /* current VectorBase<R> */
            lcb.get_const_ptr(),                 /* lower bounds for vec */
            ucb.get_const_ptr()                  /* upper bounds for vec */
         );

         if(max == val)
            return enterId;


         // phase 2:
         stab = 0;
         sel = R(infinity);
         ruseeps = rmaxabs * epsilon * 0.001;
         cuseeps = cmaxabs * epsilon * 0.001;

         for(j = pupd.size() - 1; j >= 0; --j)
         {
            i = pupd.index(j);
            x = pupd[i];

            if(x > ruseeps)
            {
               y = lpb[i] - pvec[i];

               if(y > degeneps)
                  this->solver()->shiftLPbound(i, pvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && x > stab)         // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = x;
                  }
               }
            }
            else if(x < -ruseeps)
            {
               y = upb[i] - pvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUPbound(i, pvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && -x > stab)        // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI03 removing value {}\n", pupd[i]);
               pupd.clearNum(j);
            }
         }

         for(j = cupd.size() - 1; j >= 0; --j)
         {
            i = cupd.index(j);
            x = cupd[i];

            if(x > cuseeps)
            {
               y = lcb[i] - cvec[i];

               if(y > degeneps)
                  this->solver()->shiftLCbound(i, cvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && x > stab)         // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = x;
                  }
               }
            }
            else if(x < -cuseeps)
            {
               y = ucb[i] - cvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUCbound(i, cvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && -x > stab)        // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI04 removing value {}\n", x);
               cupd.clearNum(j);
            }
         }

         if(lastshift == this->solver()->shift())
         {
            if(cnr >= 0)
            {
               if(this->solver()->isBasic(enterId))
               {
                  cupd.clearNum(cnr);
                  continue;
               }
               else
                  break;
            }
            else if(pnr >= 0)
            {
               pvec[pnr] = this->solver()->vector(pnr) * cvec;

               if(this->solver()->isBasic(enterId))
               {
                  pupd.setValue(pnr, 0.0);
                  continue;
               }
               else
               {
                  x = pupd[pnr];

                  if(x > 0)
                  {
                     sel = lpb[pnr] - pvec[pnr];

                     if(x < minStability && -sel < this->delta)
                     {
                        minStability /= 2;
                        this->solver()->shiftLPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }
                  else
                  {
                     sel = upb[pnr] - pvec[pnr];

                     if(-x < minStability && sel < this->delta)
                     {
                        minStability /= 2;
                        this->solver()->shiftUPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }

                  sel /= x;
               }
            }
            else
            {
               val = 0;
               enterId.inValidate();
               return enterId;
            }

            if(sel < max)              // instability detected => recompute
               continue;               // ratio test with corrected value

            break;
         }
      }
   }

   assert(max * val >= 0);
   assert(enterId.type() != SPxId::INVALID);

   val = sel;

   return enterId;
}